

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_kv_functional_test.cc
# Opt level: O3

void multi_kv_rollback_test(uint8_t opt,size_t chunksize)

{
  fdb_status fVar1;
  int iVar2;
  size_t sVar3;
  char *pcVar4;
  char *pcVar5;
  fdb_config *pfVar6;
  code *fconfig;
  char **kvs_names_00;
  fdb_config *pfVar7;
  char *pcVar8;
  undefined7 in_register_00000039;
  uint uVar9;
  fdb_config *unaff_R12;
  char *pcVar10;
  fdb_doc *doc_00;
  char *unaff_R13;
  fdb_custom_cmp_variable *functions_00;
  fdb_config *pfVar11;
  long lVar12;
  fdb_doc *doc;
  fdb_kvs_handle *kv2;
  fdb_kvs_handle *kv1;
  fdb_file_handle *dbfile;
  fdb_kvs_handle *db;
  fdb_seqnum_t seq3;
  fdb_seqnum_t seq2;
  fdb_seqnum_t seq1;
  fdb_custom_cmp_variable functions [3];
  char *kvs_names [3];
  char value [256];
  char key [256];
  timeval __test_begin;
  timeval tStackY_1520;
  fdb_config fStackY_1510;
  fdb_file_handle *apfStackY_1418 [100];
  fdb_config *pfStackY_10f8;
  fdb_custom_cmp_variable *pp_StackY_10f0;
  fdb_config *pfStackY_10e8;
  fdb_file_handle *pfStack_10d0;
  fdb_config *pfStack_10c8;
  fdb_kvs_handle *pfStack_10c0;
  fdb_kvs_config fStack_10b8;
  timeval tStack_10a0;
  char acStack_1090 [264];
  fdb_config fStack_f88;
  fdb_custom_cmp_variable ap_Stack_e90 [33];
  char **ppcStack_d88;
  fdb_doc *pfStack_d80;
  fdb_config *pfStack_d78;
  fdb_custom_cmp_variable *pp_Stack_d70;
  fdb_config *pfStack_d68;
  fdb_config *pfStack_d60;
  undefined1 auStack_d48 [24];
  fdb_kvs_handle *pfStack_d30;
  fdb_kvs_handle *pfStack_d28;
  fdb_kvs_config fStack_d20;
  fdb_custom_cmp_variable p_Stack_d08;
  code *pcStack_d00;
  code *pcStack_cf8;
  char *pcStack_ce8;
  char *pcStack_ce0;
  char *pcStack_cd8;
  timeval tStack_cc8;
  fdb_config fStack_cb8;
  fdb_config fStack_bb0;
  fdb_custom_cmp_variable ap_Stack_ab8 [33];
  fdb_config *pfStack_9b0;
  fdb_config *pfStack_9a8;
  fdb_config *pfStack_9a0;
  fdb_config *pfStack_998;
  fdb_config *pfStack_990;
  fdb_config *pfStack_988;
  undefined1 auStack_978 [24];
  fdb_kvs_handle *pfStack_960;
  fdb_kvs_handle *pfStack_958;
  fdb_iterator *pfStack_950;
  fdb_kvs_config fStack_948;
  fdb_config fStack_930;
  timeval tStack_830;
  fdb_config fStack_820;
  fdb_config fStack_718;
  fdb_custom_cmp_variable ap_Stack_620 [32];
  char *apcStack_520 [33];
  char *pcStack_418;
  fdb_config *pfStack_410;
  fdb_config *pfStack_408;
  fdb_config *pfStack_400;
  fdb_config *pfStack_3f8;
  fdb_config *pfStack_3f0;
  undefined1 local_3d8 [24];
  fdb_file_handle *local_3c0;
  fdb_kvs_handle *local_3b8;
  uint local_3ac;
  fdb_seqnum_t local_3a8;
  fdb_seqnum_t local_3a0;
  fdb_seqnum_t local_398;
  fdb_kvs_config local_390;
  fdb_custom_cmp_variable local_378;
  code *pcStack_370;
  code *local_368;
  char *local_358;
  char *pcStack_350;
  char *local_348;
  fdb_config local_338;
  fdb_config local_238;
  timeval local_138;
  fdb_config local_128;
  
  pcVar4 = (char *)(CONCAT71(in_register_00000039,opt) & 0xffffffff);
  pfVar11 = (fdb_config *)0x0;
  pfStack_3f0 = (fdb_config *)0x113cca;
  gettimeofday(&local_138,(__timezone_ptr_t)0x0);
  local_348 = "kv2";
  local_358 = (char *)0x0;
  pcStack_350 = "kv1";
  local_368 = _multi_kv_test_keycmp;
  local_378 = _multi_kv_test_keycmp;
  pcStack_370 = _multi_kv_test_keycmp;
  local_338.wal_threshold._0_1_ = '_';
  local_338.wal_threshold._1_1_ = 't';
  local_338.wal_threshold._2_1_ = 'e';
  local_338.wal_threshold._3_1_ = 's';
  local_338.wal_threshold._4_3_ = 0x2a74;
  local_338._0_8_ = 0x202066722d206d72;
  local_338.buffercache_size._0_1_ = 'm';
  local_338.buffercache_size._1_1_ = 'u';
  local_338.buffercache_size._2_1_ = 'l';
  local_338.buffercache_size._3_1_ = 't';
  local_338.buffercache_size._4_1_ = 'i';
  local_338.buffercache_size._5_1_ = '_';
  local_338.buffercache_size._6_1_ = 'k';
  local_338.buffercache_size._7_1_ = 'v';
  pfStack_3f0 = (fdb_config *)0x113d28;
  system((char *)&local_338);
  pfStack_3f0 = (fdb_config *)0x113d2d;
  memleak_start();
  pcVar8 = (char *)&local_128;
  pfStack_3f0 = (fdb_config *)0x113d3d;
  fdb_get_default_config();
  pfStack_3f0 = (fdb_config *)0x113d47;
  fdb_get_default_kvs_config();
  local_128.seqtree_opt = '\x01';
  local_128.chunksize = (uint16_t)chunksize;
  local_128.multi_kv_instances = true;
  local_128.wal_threshold = 1000;
  local_128.buffercache_size = 0;
  local_128.block_reusing_threshold = 0;
  local_3ac = (uint)CONCAT71(in_register_00000039,opt);
  pcVar10 = (char *)unaff_R12;
  pcVar5 = (char *)chunksize;
  if ((opt & 1) != 0) {
LAB_00113d93:
    pfStack_3f0 = (fdb_config *)0x113dc6;
    fVar1 = fdb_open_custom_cmp(&local_3c0,"./multi_kv_test",&local_128,3,&local_358,&local_378,
                                (void **)0x0);
    if (fVar1 == FDB_RESULT_SUCCESS) goto LAB_00113dce;
    goto LAB_0011512f;
  }
  pfStack_3f0 = (fdb_config *)0x113d8a;
  fVar1 = fdb_open(&local_3c0,"./multi_kv_test",&local_128);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    pfStack_3f0 = (fdb_config *)0x113d93;
    multi_kv_rollback_test();
    goto LAB_00113d93;
  }
LAB_00113dce:
  pfStack_3f0 = (fdb_config *)0x113de4;
  fVar1 = fdb_kvs_open(local_3c0,&local_3b8,(char *)0x0,&local_390);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001150df;
  pfStack_3f0 = (fdb_config *)0x113e07;
  fVar1 = fdb_kvs_open(local_3c0,(fdb_kvs_handle **)(local_3d8 + 0x10),"kv1",&local_390);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001150e4;
  pfStack_3f0 = (fdb_config *)0x113e2a;
  fVar1 = fdb_kvs_open(local_3c0,(fdb_kvs_handle **)(local_3d8 + 8),"kv2",&local_390);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001150e9;
  pcVar5 = "value%08d(%s)";
  pcVar4 = (char *)&local_338;
  pcVar8 = (char *)0x0;
  do {
    pfVar11 = (fdb_config *)local_3d8;
    unaff_R12 = &local_238;
    pfStack_3f0 = (fdb_config *)0x113e65;
    sprintf((char *)unaff_R12,"key%06d",pcVar8);
    pfStack_3f0 = (fdb_config *)0x113e7c;
    sprintf(pcVar4,"value%08d(%s)",pcVar8);
    pfStack_3f0 = (fdb_config *)0x113e84;
    sVar3 = strlen((char *)unaff_R12);
    unaff_R13 = (char *)(sVar3 + 1);
    pfStack_3f0 = (fdb_config *)0x113e90;
    sVar3 = strlen(pcVar4);
    pfStack_3f0 = (fdb_config *)0x113ead;
    fdb_doc_create((fdb_doc **)pfVar11,unaff_R12,(size_t)unaff_R13,(void *)0x0,0,pcVar4,sVar3 + 1);
    pfStack_3f0 = (fdb_config *)0x113ebc;
    fVar1 = fdb_set(local_3b8,(fdb_doc *)local_3d8._0_8_);
    if (fVar1 != FDB_RESULT_SUCCESS) {
LAB_00114f84:
      pfStack_3f0 = (fdb_config *)0x114f89;
      multi_kv_rollback_test();
LAB_00114f89:
      pfStack_3f0 = (fdb_config *)0x114f8e;
      multi_kv_rollback_test();
      goto LAB_00114f8e;
    }
    pfStack_3f0 = (fdb_config *)0x113ece;
    fdb_doc_free((fdb_doc *)local_3d8._0_8_);
    pfStack_3f0 = (fdb_config *)0x113ee5;
    sprintf(pcVar4,"value%08d(%s)",pcVar8);
    pfStack_3f0 = (fdb_config *)0x113eed;
    sVar3 = strlen((char *)unaff_R12);
    unaff_R13 = (char *)(sVar3 + 1);
    pfStack_3f0 = (fdb_config *)0x113ef9;
    sVar3 = strlen(pcVar4);
    pfStack_3f0 = (fdb_config *)0x113f16;
    fdb_doc_create((fdb_doc **)pfVar11,unaff_R12,(size_t)unaff_R13,(void *)0x0,0,pcVar4,sVar3 + 1);
    pfStack_3f0 = (fdb_config *)0x113f25;
    fVar1 = fdb_set((fdb_kvs_handle *)local_3d8._16_8_,(fdb_doc *)local_3d8._0_8_);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      pfStack_3f0 = (fdb_config *)0x114f84;
      multi_kv_rollback_test();
      goto LAB_00114f84;
    }
    uVar9 = (uint)pcVar8 & 0xff;
    unaff_R12 = (fdb_config *)(ulong)uVar9;
    if ((char)(((char)(uVar9 / 0xf) - (char)(uVar9 / 0xf << 4)) + (char)pcVar8) == '\0') {
      pfStack_3f0 = (fdb_config *)0x113f5f;
      fVar1 = fdb_set((fdb_kvs_handle *)local_3d8._16_8_,(fdb_doc *)local_3d8._0_8_);
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001150b7;
    }
    pfStack_3f0 = (fdb_config *)0x113f71;
    fdb_doc_free((fdb_doc *)local_3d8._0_8_);
    pfStack_3f0 = (fdb_config *)0x113f88;
    sprintf(pcVar4,"value%08d(%s)",pcVar8);
    pfStack_3f0 = (fdb_config *)0x113f9b;
    sVar3 = strlen((char *)&local_238);
    unaff_R13 = (char *)(sVar3 + 1);
    pfStack_3f0 = (fdb_config *)0x113fa7;
    sVar3 = strlen(pcVar4);
    pfStack_3f0 = (fdb_config *)0x113fc9;
    fdb_doc_create((fdb_doc **)local_3d8,&local_238,(size_t)unaff_R13,(void *)0x0,0,pcVar4,sVar3 + 1
                  );
    pfStack_3f0 = (fdb_config *)0x113fd8;
    fVar1 = fdb_set((fdb_kvs_handle *)local_3d8._8_8_,(fdb_doc *)local_3d8._0_8_);
    pfVar11 = (fdb_config *)pcVar4;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00114f89;
    if ((char)((char)(uVar9 * 0x13 >> 9) * -0x1b + (char)pcVar8) == '\0') {
      pfStack_3f0 = (fdb_config *)0x114009;
      fVar1 = fdb_set((fdb_kvs_handle *)local_3d8._8_8_,(fdb_doc *)local_3d8._0_8_);
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001150bc;
    }
    pfStack_3f0 = (fdb_config *)0x11401b;
    fdb_doc_free((fdb_doc *)local_3d8._0_8_);
    uVar9 = (uint)pcVar8 + 1;
    pcVar8 = (char *)(ulong)uVar9;
    pfVar11 = (fdb_config *)local_3d8;
    pcVar10 = (char *)&local_238;
  } while (uVar9 != 100);
  pfStack_3f0 = (fdb_config *)0x114044;
  fVar1 = fdb_commit(local_3c0,'\x01');
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001150ee;
  pfStack_3f0 = (fdb_config *)0x11405b;
  fVar1 = fdb_get_kvs_seqnum((fdb_kvs_handle *)local_3d8._16_8_,&local_398);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001150f3;
  pcVar5 = "value%08d(%s)";
  pcVar4 = (char *)&local_338;
  pcVar8 = (char *)0x0;
  do {
    pfVar11 = (fdb_config *)local_3d8;
    unaff_R12 = &local_238;
    pfStack_3f0 = (fdb_config *)0x114096;
    sprintf((char *)unaff_R12,"key%06d",pcVar8);
    pfStack_3f0 = (fdb_config *)0x1140ad;
    sprintf(pcVar4,"value%08d(%s)",pcVar8);
    pfStack_3f0 = (fdb_config *)0x1140b5;
    sVar3 = strlen((char *)unaff_R12);
    unaff_R13 = (char *)(sVar3 + 1);
    pfStack_3f0 = (fdb_config *)0x1140c1;
    sVar3 = strlen(pcVar4);
    pfStack_3f0 = (fdb_config *)0x1140de;
    fdb_doc_create((fdb_doc **)pfVar11,unaff_R12,(size_t)unaff_R13,(void *)0x0,0,pcVar4,sVar3 + 1);
    pfStack_3f0 = (fdb_config *)0x1140ed;
    fVar1 = fdb_set(local_3b8,(fdb_doc *)local_3d8._0_8_);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00114f93;
    pfStack_3f0 = (fdb_config *)0x1140ff;
    fdb_doc_free((fdb_doc *)local_3d8._0_8_);
    pfStack_3f0 = (fdb_config *)0x114116;
    sprintf(pcVar4,"value%08d(%s)",pcVar8);
    pfStack_3f0 = (fdb_config *)0x11411e;
    sVar3 = strlen((char *)unaff_R12);
    unaff_R13 = (char *)(sVar3 + 1);
    pfStack_3f0 = (fdb_config *)0x11412a;
    sVar3 = strlen(pcVar4);
    pfStack_3f0 = (fdb_config *)0x114147;
    fdb_doc_create((fdb_doc **)pfVar11,unaff_R12,(size_t)unaff_R13,(void *)0x0,0,pcVar4,sVar3 + 1);
    pfStack_3f0 = (fdb_config *)0x114156;
    fVar1 = fdb_set((fdb_kvs_handle *)local_3d8._16_8_,(fdb_doc *)local_3d8._0_8_);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00114f8e;
    uVar9 = (uint)pcVar8 & 0xff;
    unaff_R12 = (fdb_config *)(ulong)uVar9;
    if ((char)(((char)(uVar9 / 0xf) - (char)(uVar9 / 0xf << 4)) + (char)pcVar8) == '\0') {
      pfStack_3f0 = (fdb_config *)0x114190;
      fVar1 = fdb_set((fdb_kvs_handle *)local_3d8._16_8_,(fdb_doc *)local_3d8._0_8_);
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001150c1;
    }
    pfStack_3f0 = (fdb_config *)0x1141a2;
    fdb_doc_free((fdb_doc *)local_3d8._0_8_);
    pfStack_3f0 = (fdb_config *)0x1141b9;
    sprintf(pcVar4,"value%08d(%s)",pcVar8);
    pfStack_3f0 = (fdb_config *)0x1141cc;
    sVar3 = strlen((char *)&local_238);
    unaff_R13 = (char *)(sVar3 + 1);
    pfStack_3f0 = (fdb_config *)0x1141d8;
    sVar3 = strlen(pcVar4);
    pfStack_3f0 = (fdb_config *)0x1141fa;
    fdb_doc_create((fdb_doc **)local_3d8,&local_238,(size_t)unaff_R13,(void *)0x0,0,pcVar4,sVar3 + 1
                  );
    pfStack_3f0 = (fdb_config *)0x114209;
    fVar1 = fdb_set((fdb_kvs_handle *)local_3d8._8_8_,(fdb_doc *)local_3d8._0_8_);
    pfVar11 = (fdb_config *)pcVar4;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00114f98;
    if ((char)((char)(uVar9 * 0x13 >> 9) * -0x1b + (char)pcVar8) == '\0') {
      pfStack_3f0 = (fdb_config *)0x11423a;
      fVar1 = fdb_set((fdb_kvs_handle *)local_3d8._8_8_,(fdb_doc *)local_3d8._0_8_);
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001150c6;
    }
    pfStack_3f0 = (fdb_config *)0x11424c;
    fdb_doc_free((fdb_doc *)local_3d8._0_8_);
    uVar9 = (uint)pcVar8 + 1;
    pcVar8 = (char *)(ulong)uVar9;
    pfVar11 = (fdb_config *)local_3d8;
    pcVar10 = (char *)&local_238;
  } while (uVar9 != 100);
  pfStack_3f0 = (fdb_config *)0x114275;
  fVar1 = fdb_commit(local_3c0,'\x01');
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001150f8;
  pfStack_3f0 = (fdb_config *)0x11428c;
  fVar1 = fdb_get_kvs_seqnum(local_3b8,&local_3a0);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001150fd;
  pcVar5 = "value%08d(%s)";
  pcVar4 = (char *)&local_338;
  pcVar8 = (char *)0x0;
  do {
    pfVar11 = (fdb_config *)local_3d8;
    unaff_R12 = &local_238;
    pfStack_3f0 = (fdb_config *)0x1142c7;
    sprintf((char *)unaff_R12,"key%06d",pcVar8);
    pfStack_3f0 = (fdb_config *)0x1142de;
    sprintf(pcVar4,"value%08d(%s)",pcVar8);
    pfStack_3f0 = (fdb_config *)0x1142e6;
    sVar3 = strlen((char *)unaff_R12);
    unaff_R13 = (char *)(sVar3 + 1);
    pfStack_3f0 = (fdb_config *)0x1142f2;
    sVar3 = strlen(pcVar4);
    pfStack_3f0 = (fdb_config *)0x11430f;
    fdb_doc_create((fdb_doc **)pfVar11,unaff_R12,(size_t)unaff_R13,(void *)0x0,0,pcVar4,sVar3 + 1);
    pfStack_3f0 = (fdb_config *)0x11431e;
    fVar1 = fdb_set(local_3b8,(fdb_doc *)local_3d8._0_8_);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00114fa2;
    pfStack_3f0 = (fdb_config *)0x114330;
    fdb_doc_free((fdb_doc *)local_3d8._0_8_);
    pfStack_3f0 = (fdb_config *)0x114347;
    sprintf(pcVar4,"value%08d(%s)",pcVar8);
    pfStack_3f0 = (fdb_config *)0x11434f;
    sVar3 = strlen((char *)unaff_R12);
    unaff_R13 = (char *)(sVar3 + 1);
    pfStack_3f0 = (fdb_config *)0x11435b;
    sVar3 = strlen(pcVar4);
    pfStack_3f0 = (fdb_config *)0x114378;
    fdb_doc_create((fdb_doc **)pfVar11,unaff_R12,(size_t)unaff_R13,(void *)0x0,0,pcVar4,sVar3 + 1);
    pfStack_3f0 = (fdb_config *)0x114387;
    fVar1 = fdb_set((fdb_kvs_handle *)local_3d8._16_8_,(fdb_doc *)local_3d8._0_8_);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00114f9d;
    uVar9 = (uint)pcVar8 & 0xff;
    unaff_R12 = (fdb_config *)(ulong)uVar9;
    if ((char)(((char)(uVar9 / 0xf) - (char)(uVar9 / 0xf << 4)) + (char)pcVar8) == '\0') {
      pfStack_3f0 = (fdb_config *)0x1143c1;
      fVar1 = fdb_set((fdb_kvs_handle *)local_3d8._16_8_,(fdb_doc *)local_3d8._0_8_);
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001150cb;
    }
    pfStack_3f0 = (fdb_config *)0x1143d3;
    fdb_doc_free((fdb_doc *)local_3d8._0_8_);
    pfStack_3f0 = (fdb_config *)0x1143ea;
    sprintf(pcVar4,"value%08d(%s)",pcVar8);
    pfStack_3f0 = (fdb_config *)0x1143fd;
    sVar3 = strlen((char *)&local_238);
    unaff_R13 = (char *)(sVar3 + 1);
    pfStack_3f0 = (fdb_config *)0x114409;
    sVar3 = strlen(pcVar4);
    pfStack_3f0 = (fdb_config *)0x11442b;
    fdb_doc_create((fdb_doc **)local_3d8,&local_238,(size_t)unaff_R13,(void *)0x0,0,pcVar4,sVar3 + 1
                  );
    pfStack_3f0 = (fdb_config *)0x11443a;
    fVar1 = fdb_set((fdb_kvs_handle *)local_3d8._8_8_,(fdb_doc *)local_3d8._0_8_);
    pfVar11 = (fdb_config *)pcVar4;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00114fa7;
    if ((char)((char)(uVar9 * 0x13 >> 9) * -0x1b + (char)pcVar8) == '\0') {
      pfStack_3f0 = (fdb_config *)0x11446b;
      fVar1 = fdb_set((fdb_kvs_handle *)local_3d8._8_8_,(fdb_doc *)local_3d8._0_8_);
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001150d0;
    }
    pfStack_3f0 = (fdb_config *)0x11447d;
    fdb_doc_free((fdb_doc *)local_3d8._0_8_);
    uVar9 = (uint)pcVar8 + 1;
    pcVar8 = (char *)(ulong)uVar9;
    pfVar11 = (fdb_config *)local_3d8;
    pcVar10 = (char *)&local_238;
  } while (uVar9 != 100);
  pfStack_3f0 = (fdb_config *)0x1144a3;
  fVar1 = fdb_commit(local_3c0,'\0');
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00115102;
  pfStack_3f0 = (fdb_config *)0x1144ba;
  fVar1 = fdb_get_kvs_seqnum((fdb_kvs_handle *)local_3d8._8_8_,&local_3a8);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00115107;
  pcVar5 = "value%08d(%s)";
  pcVar4 = (char *)&local_338;
  pcVar8 = (char *)0x0;
  do {
    pfVar11 = (fdb_config *)local_3d8;
    unaff_R12 = &local_238;
    pfStack_3f0 = (fdb_config *)0x1144f5;
    sprintf((char *)unaff_R12,"key%06d",pcVar8);
    pfStack_3f0 = (fdb_config *)0x11450c;
    sprintf(pcVar4,"value%08d(%s)",pcVar8);
    pfStack_3f0 = (fdb_config *)0x114514;
    sVar3 = strlen((char *)unaff_R12);
    unaff_R13 = (char *)(sVar3 + 1);
    pfStack_3f0 = (fdb_config *)0x114520;
    sVar3 = strlen(pcVar4);
    pfStack_3f0 = (fdb_config *)0x11453d;
    fdb_doc_create((fdb_doc **)pfVar11,unaff_R12,(size_t)unaff_R13,(void *)0x0,0,pcVar4,sVar3 + 1);
    pfStack_3f0 = (fdb_config *)0x11454c;
    fVar1 = fdb_set(local_3b8,(fdb_doc *)local_3d8._0_8_);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00114fb1;
    pfStack_3f0 = (fdb_config *)0x11455e;
    fdb_doc_free((fdb_doc *)local_3d8._0_8_);
    pfStack_3f0 = (fdb_config *)0x114575;
    sprintf(pcVar4,"value%08d(%s)",pcVar8);
    pfStack_3f0 = (fdb_config *)0x11457d;
    sVar3 = strlen((char *)unaff_R12);
    unaff_R13 = (char *)(sVar3 + 1);
    pfStack_3f0 = (fdb_config *)0x114589;
    sVar3 = strlen(pcVar4);
    pfStack_3f0 = (fdb_config *)0x1145a6;
    fdb_doc_create((fdb_doc **)pfVar11,unaff_R12,(size_t)unaff_R13,(void *)0x0,0,pcVar4,sVar3 + 1);
    pfStack_3f0 = (fdb_config *)0x1145b5;
    fVar1 = fdb_set((fdb_kvs_handle *)local_3d8._16_8_,(fdb_doc *)local_3d8._0_8_);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00114fac;
    uVar9 = (uint)pcVar8 & 0xff;
    unaff_R12 = (fdb_config *)(ulong)uVar9;
    if ((char)(((char)(uVar9 / 0xf) - (char)(uVar9 / 0xf << 4)) + (char)pcVar8) == '\0') {
      pfStack_3f0 = (fdb_config *)0x1145ef;
      fVar1 = fdb_set((fdb_kvs_handle *)local_3d8._16_8_,(fdb_doc *)local_3d8._0_8_);
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001150d5;
    }
    pfStack_3f0 = (fdb_config *)0x114601;
    fdb_doc_free((fdb_doc *)local_3d8._0_8_);
    pfStack_3f0 = (fdb_config *)0x114618;
    sprintf(pcVar4,"value%08d(%s)",pcVar8);
    pfStack_3f0 = (fdb_config *)0x11462b;
    sVar3 = strlen((char *)&local_238);
    unaff_R13 = (char *)(sVar3 + 1);
    pfStack_3f0 = (fdb_config *)0x114637;
    sVar3 = strlen(pcVar4);
    pfStack_3f0 = (fdb_config *)0x114659;
    fdb_doc_create((fdb_doc **)local_3d8,&local_238,(size_t)unaff_R13,(void *)0x0,0,pcVar4,sVar3 + 1
                  );
    pfStack_3f0 = (fdb_config *)0x114668;
    fVar1 = fdb_set((fdb_kvs_handle *)local_3d8._8_8_,(fdb_doc *)local_3d8._0_8_);
    pfVar11 = (fdb_config *)pcVar4;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00114fb6;
    if ((char)((char)(uVar9 * 0x13 >> 9) * -0x1b + (char)pcVar8) == '\0') {
      pfStack_3f0 = (fdb_config *)0x114699;
      fVar1 = fdb_set((fdb_kvs_handle *)local_3d8._8_8_,(fdb_doc *)local_3d8._0_8_);
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001150da;
    }
    pfStack_3f0 = (fdb_config *)0x1146ab;
    fdb_doc_free((fdb_doc *)local_3d8._0_8_);
    uVar9 = (uint)pcVar8 + 1;
    pcVar8 = (char *)(ulong)uVar9;
    pfVar11 = (fdb_config *)local_3d8;
    pcVar10 = (char *)&local_238;
  } while (uVar9 != 100);
  pfStack_3f0 = (fdb_config *)0x1146d1;
  fVar1 = fdb_commit(local_3c0,'\0');
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011510c;
  pfStack_3f0 = (fdb_config *)0x1146e8;
  fVar1 = fdb_rollback((fdb_kvs_handle **)(local_3d8 + 0x10),local_398);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00115111;
  pcVar8 = (char *)&local_238;
  unaff_R13 = (char *)&local_338;
  pcVar4 = local_3d8;
  pcVar5 = (char *)0x0;
  do {
    pfStack_3f0 = (fdb_config *)0x11471a;
    sprintf(pcVar8,"key%06d",pcVar5);
    pfStack_3f0 = (fdb_config *)0x114734;
    sprintf(unaff_R13,"value%08d(%s)",pcVar5);
    pfStack_3f0 = (fdb_config *)0x11473c;
    sVar3 = strlen(pcVar8);
    pfStack_3f0 = (fdb_config *)0x11475b;
    fdb_doc_create((fdb_doc **)pcVar4,pcVar8,sVar3 + 1,(void *)0x0,0,(void *)0x0,0);
    pfStack_3f0 = (fdb_config *)0x11476a;
    fVar1 = fdb_get(local_3b8,(fdb_doc *)local_3d8._0_8_);
    unaff_R12 = (fdb_config *)local_3d8._0_8_;
    pfVar7 = (fdb_config *)pcVar10;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00114fcb;
    pfVar11 = *(fdb_config **)(local_3d8._0_8_ + 0x40);
    pfStack_3f0 = (fdb_config *)0x11478c;
    iVar2 = bcmp(unaff_R13,pfVar11,*(uint64_t *)(local_3d8._0_8_ + 0x10));
    if (iVar2 != 0) goto LAB_00114fbb;
    pfStack_3f0 = (fdb_config *)0x11479c;
    fdb_doc_free((fdb_doc *)unaff_R12);
    pfStack_3f0 = (fdb_config *)0x1147b6;
    sprintf(unaff_R13,"value%08d(%s)",pcVar5);
    pfStack_3f0 = (fdb_config *)0x1147be;
    sVar3 = strlen(pcVar8);
    pfStack_3f0 = (fdb_config *)0x1147dd;
    fdb_doc_create((fdb_doc **)pcVar4,pcVar8,sVar3 + 1,(void *)0x0,0,(void *)0x0,0);
    pfStack_3f0 = (fdb_config *)0x1147ec;
    fVar1 = fdb_get((fdb_kvs_handle *)local_3d8._16_8_,(fdb_doc *)local_3d8._0_8_);
    pfVar7 = (fdb_config *)local_3d8._0_8_;
    pcVar10 = (char *)unaff_R12;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00114fe0;
    pfVar11 = *(fdb_config **)(local_3d8._0_8_ + 0x40);
    pfStack_3f0 = (fdb_config *)0x11480e;
    iVar2 = bcmp(unaff_R13,pfVar11,*(uint64_t *)(local_3d8._0_8_ + 0x10));
    if (iVar2 != 0) goto LAB_00114fd0;
    pfStack_3f0 = (fdb_config *)0x11481e;
    fdb_doc_free((fdb_doc *)pfVar7);
    pfStack_3f0 = (fdb_config *)0x114838;
    sprintf(unaff_R13,"value%08d(%s)",pcVar5);
    pfStack_3f0 = (fdb_config *)0x114840;
    sVar3 = strlen(pcVar8);
    pfStack_3f0 = (fdb_config *)0x11485f;
    fdb_doc_create((fdb_doc **)pcVar4,pcVar8,sVar3 + 1,(void *)0x0,0,(void *)0x0,0);
    pfStack_3f0 = (fdb_config *)0x11486e;
    fVar1 = fdb_get((fdb_kvs_handle *)local_3d8._8_8_,(fdb_doc *)local_3d8._0_8_);
    pcVar10 = (char *)local_3d8._0_8_;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00114ff5;
    pfVar11 = *(fdb_config **)(local_3d8._0_8_ + 0x40);
    pfStack_3f0 = (fdb_config *)0x114890;
    iVar2 = bcmp(unaff_R13,pfVar11,*(uint64_t *)(local_3d8._0_8_ + 0x10));
    if (iVar2 != 0) goto LAB_00114fe5;
    pfStack_3f0 = (fdb_config *)0x1148a0;
    fdb_doc_free((fdb_doc *)pcVar10);
    uVar9 = (int)pcVar5 + 1;
    pcVar5 = (char *)(ulong)uVar9;
  } while (uVar9 != 100);
  pfStack_3f0 = (fdb_config *)0x1148ba;
  fVar1 = fdb_rollback(&local_3b8,local_3a0);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00115116;
  pcVar8 = (char *)&local_238;
  unaff_R13 = (char *)&local_338;
  pcVar4 = local_3d8;
  pcVar5 = (char *)0x0;
  do {
    pfStack_3f0 = (fdb_config *)0x1148ec;
    sprintf(pcVar8,"key%06d",pcVar5);
    pfStack_3f0 = (fdb_config *)0x114906;
    sprintf(unaff_R13,"value%08d(%s)",pcVar5);
    pfStack_3f0 = (fdb_config *)0x11490e;
    sVar3 = strlen(pcVar8);
    pfStack_3f0 = (fdb_config *)0x11492d;
    fdb_doc_create((fdb_doc **)pcVar4,pcVar8,sVar3 + 1,(void *)0x0,0,(void *)0x0,0);
    pfStack_3f0 = (fdb_config *)0x11493c;
    fVar1 = fdb_get(local_3b8,(fdb_doc *)local_3d8._0_8_);
    pfVar7 = (fdb_config *)local_3d8._0_8_;
    pfVar6 = (fdb_config *)pcVar10;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011500a;
    pfVar11 = *(fdb_config **)(local_3d8._0_8_ + 0x40);
    pfStack_3f0 = (fdb_config *)0x11495e;
    iVar2 = bcmp(unaff_R13,pfVar11,*(uint64_t *)(local_3d8._0_8_ + 0x10));
    if (iVar2 != 0) goto LAB_00114ffa;
    pfStack_3f0 = (fdb_config *)0x11496e;
    fdb_doc_free((fdb_doc *)pfVar7);
    pfStack_3f0 = (fdb_config *)0x114988;
    sprintf(unaff_R13,"value%08d(%s)",pcVar5);
    pfStack_3f0 = (fdb_config *)0x114990;
    sVar3 = strlen(pcVar8);
    pfStack_3f0 = (fdb_config *)0x1149af;
    fdb_doc_create((fdb_doc **)pcVar4,pcVar8,sVar3 + 1,(void *)0x0,0,(void *)0x0,0);
    pfStack_3f0 = (fdb_config *)0x1149be;
    fVar1 = fdb_get((fdb_kvs_handle *)local_3d8._16_8_,(fdb_doc *)local_3d8._0_8_);
    pfVar6 = (fdb_config *)local_3d8._0_8_;
    pcVar10 = (char *)pfVar7;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011501f;
    pfVar11 = *(fdb_config **)(local_3d8._0_8_ + 0x40);
    pfStack_3f0 = (fdb_config *)0x1149e0;
    iVar2 = bcmp(unaff_R13,pfVar11,*(uint64_t *)(local_3d8._0_8_ + 0x10));
    if (iVar2 != 0) goto LAB_0011500f;
    pfStack_3f0 = (fdb_config *)0x1149f0;
    fdb_doc_free((fdb_doc *)pfVar6);
    pfStack_3f0 = (fdb_config *)0x114a0a;
    sprintf(unaff_R13,"value%08d(%s)",pcVar5);
    pfStack_3f0 = (fdb_config *)0x114a12;
    sVar3 = strlen(pcVar8);
    pfStack_3f0 = (fdb_config *)0x114a31;
    fdb_doc_create((fdb_doc **)pcVar4,pcVar8,sVar3 + 1,(void *)0x0,0,(void *)0x0,0);
    pfStack_3f0 = (fdb_config *)0x114a40;
    fVar1 = fdb_get((fdb_kvs_handle *)local_3d8._8_8_,(fdb_doc *)local_3d8._0_8_);
    pcVar10 = (char *)local_3d8._0_8_;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00115034;
    pfVar11 = *(fdb_config **)(local_3d8._0_8_ + 0x40);
    pfStack_3f0 = (fdb_config *)0x114a62;
    iVar2 = bcmp(unaff_R13,pfVar11,*(uint64_t *)(local_3d8._0_8_ + 0x10));
    if (iVar2 != 0) goto LAB_00115024;
    pfStack_3f0 = (fdb_config *)0x114a72;
    fdb_doc_free((fdb_doc *)pcVar10);
    uVar9 = (int)pcVar5 + 1;
    pcVar5 = (char *)(ulong)uVar9;
  } while (uVar9 != 100);
  pfStack_3f0 = (fdb_config *)0x114a8c;
  fVar1 = fdb_rollback((fdb_kvs_handle **)(local_3d8 + 8),local_3a8);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011511b;
  pcVar8 = (char *)&local_238;
  unaff_R13 = (char *)&local_338;
  pcVar4 = local_3d8;
  pcVar5 = (char *)0x0;
  do {
    pfStack_3f0 = (fdb_config *)0x114abe;
    sprintf(pcVar8,"key%06d",pcVar5);
    pfStack_3f0 = (fdb_config *)0x114ad8;
    sprintf(unaff_R13,"value%08d(%s)",pcVar5);
    pfStack_3f0 = (fdb_config *)0x114ae0;
    sVar3 = strlen(pcVar8);
    pfStack_3f0 = (fdb_config *)0x114aff;
    fdb_doc_create((fdb_doc **)pcVar4,pcVar8,sVar3 + 1,(void *)0x0,0,(void *)0x0,0);
    pfStack_3f0 = (fdb_config *)0x114b0e;
    fVar1 = fdb_get(local_3b8,(fdb_doc *)local_3d8._0_8_);
    pfVar6 = (fdb_config *)local_3d8._0_8_;
    pfVar7 = (fdb_config *)pcVar10;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00115049;
    pfVar11 = *(fdb_config **)(local_3d8._0_8_ + 0x40);
    pfStack_3f0 = (fdb_config *)0x114b30;
    iVar2 = bcmp(unaff_R13,pfVar11,*(uint64_t *)(local_3d8._0_8_ + 0x10));
    if (iVar2 != 0) goto LAB_00115039;
    pfStack_3f0 = (fdb_config *)0x114b40;
    fdb_doc_free((fdb_doc *)pfVar6);
    pfStack_3f0 = (fdb_config *)0x114b5a;
    sprintf(unaff_R13,"value%08d(%s)",pcVar5);
    pfStack_3f0 = (fdb_config *)0x114b62;
    sVar3 = strlen(pcVar8);
    pfStack_3f0 = (fdb_config *)0x114b81;
    fdb_doc_create((fdb_doc **)pcVar4,pcVar8,sVar3 + 1,(void *)0x0,0,(void *)0x0,0);
    pfStack_3f0 = (fdb_config *)0x114b90;
    fVar1 = fdb_get((fdb_kvs_handle *)local_3d8._16_8_,(fdb_doc *)local_3d8._0_8_);
    pfVar7 = (fdb_config *)local_3d8._0_8_;
    pcVar10 = (char *)pfVar6;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011505e;
    pfVar11 = *(fdb_config **)(local_3d8._0_8_ + 0x40);
    pfStack_3f0 = (fdb_config *)0x114bb2;
    iVar2 = bcmp(unaff_R13,pfVar11,*(uint64_t *)(local_3d8._0_8_ + 0x10));
    if (iVar2 != 0) goto LAB_0011504e;
    pfStack_3f0 = (fdb_config *)0x114bc2;
    fdb_doc_free((fdb_doc *)pfVar7);
    pfStack_3f0 = (fdb_config *)0x114bdc;
    sprintf(unaff_R13,"value%08d(%s)",pcVar5);
    pfStack_3f0 = (fdb_config *)0x114be4;
    sVar3 = strlen(pcVar8);
    pfStack_3f0 = (fdb_config *)0x114c03;
    fdb_doc_create((fdb_doc **)pcVar4,pcVar8,sVar3 + 1,(void *)0x0,0,(void *)0x0,0);
    pfStack_3f0 = (fdb_config *)0x114c12;
    fVar1 = fdb_get((fdb_kvs_handle *)local_3d8._8_8_,(fdb_doc *)local_3d8._0_8_);
    pcVar10 = (char *)local_3d8._0_8_;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00115073;
    pfVar11 = *(fdb_config **)(local_3d8._0_8_ + 0x40);
    pfStack_3f0 = (fdb_config *)0x114c34;
    iVar2 = bcmp(unaff_R13,pfVar11,*(uint64_t *)(local_3d8._0_8_ + 0x10));
    if (iVar2 != 0) goto LAB_00115063;
    pfStack_3f0 = (fdb_config *)0x114c44;
    fdb_doc_free((fdb_doc *)pcVar10);
    uVar9 = (int)pcVar5 + 1;
    pcVar5 = (char *)(ulong)uVar9;
  } while (uVar9 != 100);
  pfStack_3f0 = (fdb_config *)0x114c59;
  fVar1 = fdb_kvs_close((fdb_kvs_handle *)local_3d8._16_8_);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00115120;
  pfStack_3f0 = (fdb_config *)0x114c6b;
  fVar1 = fdb_kvs_close((fdb_kvs_handle *)local_3d8._8_8_);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00115125;
  pfStack_3f0 = (fdb_config *)0x114c7d;
  fVar1 = fdb_close(local_3c0);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011512a;
  if ((local_3ac & 1) == 0) {
    pfStack_3f0 = (fdb_config *)0x114ca5;
    fVar1 = fdb_open(&local_3c0,"./multi_kv_test",&local_128);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      pfStack_3f0 = (fdb_config *)0x114cae;
      multi_kv_rollback_test();
      goto LAB_00114cae;
    }
LAB_00114ce9:
    pfStack_3f0 = (fdb_config *)0x114d02;
    fdb_kvs_open(local_3c0,&local_3b8,(char *)0x0,&local_390);
    pfStack_3f0 = (fdb_config *)0x114d1b;
    fdb_kvs_open(local_3c0,(fdb_kvs_handle **)(local_3d8 + 0x10),"kv1",&local_390);
    pfStack_3f0 = (fdb_config *)0x114d34;
    fdb_kvs_open(local_3c0,(fdb_kvs_handle **)(local_3d8 + 8),"kv2",&local_390);
    pcVar8 = (char *)&local_238;
    unaff_R13 = (char *)&local_338;
    pcVar4 = local_3d8;
    pcVar5 = (char *)0x0;
    while( true ) {
      pfStack_3f0 = (fdb_config *)0x114d5e;
      sprintf(pcVar8,"key%06d",pcVar5);
      pfStack_3f0 = (fdb_config *)0x114d78;
      sprintf(unaff_R13,"value%08d(%s)",pcVar5);
      pfStack_3f0 = (fdb_config *)0x114d80;
      sVar3 = strlen(pcVar8);
      pfStack_3f0 = (fdb_config *)0x114d9f;
      fdb_doc_create((fdb_doc **)pcVar4,pcVar8,sVar3 + 1,(void *)0x0,0,(void *)0x0,0);
      pfStack_3f0 = (fdb_config *)0x114dae;
      fVar1 = fdb_get(local_3b8,(fdb_doc *)local_3d8._0_8_);
      pfVar7 = (fdb_config *)local_3d8._0_8_;
      unaff_R12 = (fdb_config *)pcVar10;
      if (fVar1 != FDB_RESULT_SUCCESS) break;
      pfVar11 = *(fdb_config **)(local_3d8._0_8_ + 0x40);
      pfStack_3f0 = (fdb_config *)0x114dd0;
      iVar2 = bcmp(unaff_R13,pfVar11,*(uint64_t *)(local_3d8._0_8_ + 0x10));
      if (iVar2 != 0) goto LAB_00115078;
      pfStack_3f0 = (fdb_config *)0x114de0;
      fdb_doc_free((fdb_doc *)pfVar7);
      pfStack_3f0 = (fdb_config *)0x114dfa;
      sprintf(unaff_R13,"value%08d(%s)",pcVar5);
      pfStack_3f0 = (fdb_config *)0x114e02;
      sVar3 = strlen(pcVar8);
      pfStack_3f0 = (fdb_config *)0x114e21;
      fdb_doc_create((fdb_doc **)pcVar4,pcVar8,sVar3 + 1,(void *)0x0,0,(void *)0x0,0);
      pfStack_3f0 = (fdb_config *)0x114e30;
      fVar1 = fdb_get((fdb_kvs_handle *)local_3d8._16_8_,(fdb_doc *)local_3d8._0_8_);
      unaff_R12 = (fdb_config *)local_3d8._0_8_;
      pcVar10 = (char *)pfVar7;
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011509d;
      pfVar11 = *(fdb_config **)(local_3d8._0_8_ + 0x40);
      pfStack_3f0 = (fdb_config *)0x114e52;
      iVar2 = bcmp(unaff_R13,pfVar11,*(uint64_t *)(local_3d8._0_8_ + 0x10));
      if (iVar2 != 0) goto LAB_0011508d;
      pfStack_3f0 = (fdb_config *)0x114e62;
      fdb_doc_free((fdb_doc *)unaff_R12);
      pfStack_3f0 = (fdb_config *)0x114e7c;
      sprintf(unaff_R13,"value%08d(%s)",pcVar5);
      pfStack_3f0 = (fdb_config *)0x114e84;
      sVar3 = strlen(pcVar8);
      pfStack_3f0 = (fdb_config *)0x114ea3;
      fdb_doc_create((fdb_doc **)pcVar4,pcVar8,sVar3 + 1,(void *)0x0,0,(void *)0x0,0);
      pfStack_3f0 = (fdb_config *)0x114eb2;
      fVar1 = fdb_get((fdb_kvs_handle *)local_3d8._8_8_,(fdb_doc *)local_3d8._0_8_);
      pcVar10 = (char *)local_3d8._0_8_;
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001150b2;
      pfVar11 = *(fdb_config **)(local_3d8._0_8_ + 0x40);
      pfStack_3f0 = (fdb_config *)0x114ed4;
      iVar2 = bcmp(unaff_R13,pfVar11,*(uint64_t *)(local_3d8._0_8_ + 0x10));
      if (iVar2 != 0) goto LAB_001150a2;
      pfStack_3f0 = (fdb_config *)0x114ee4;
      fdb_doc_free((fdb_doc *)pcVar10);
      uVar9 = (int)pcVar5 + 1;
      pcVar5 = (char *)(ulong)uVar9;
      if (uVar9 == 100) {
        pfStack_3f0 = (fdb_config *)0x114ef9;
        fdb_kvs_close((fdb_kvs_handle *)local_3d8._16_8_);
        pfStack_3f0 = (fdb_config *)0x114f03;
        fdb_kvs_close((fdb_kvs_handle *)local_3d8._8_8_);
        pfStack_3f0 = (fdb_config *)0x114f0d;
        fdb_close(local_3c0);
        pfStack_3f0 = (fdb_config *)0x114f12;
        fdb_shutdown();
        pfStack_3f0 = (fdb_config *)0x114f17;
        memleak_end();
        if ((local_3ac & 1) == 0) {
          if ((multi_kv_rollback_test(unsigned_char,unsigned_long)::__test_pass & 1) == 0) {
            pcVar8 = "%s PASSED\n";
          }
          else {
            pcVar8 = "%s FAILED\n";
          }
          pcVar4 = "multiple KV instances rollback test";
        }
        else {
          if ((multi_kv_rollback_test(unsigned_char,unsigned_long)::__test_pass & 1) == 0) {
            pcVar8 = "%s PASSED\n";
          }
          else {
            pcVar8 = "%s FAILED\n";
          }
          pcVar4 = "multiple KV instances rollback test (custom key order)";
        }
        pfStack_3f0 = (fdb_config *)0x114f6d;
        fprintf(_stderr,pcVar8,pcVar4);
        return;
      }
    }
    goto LAB_00115088;
  }
LAB_00114cae:
  pfStack_3f0 = (fdb_config *)0x114ce1;
  fVar1 = fdb_open_custom_cmp(&local_3c0,"./multi_kv_test",&local_128,3,&local_358,&local_378,
                              (void **)0x0);
  if (fVar1 == FDB_RESULT_SUCCESS) goto LAB_00114ce9;
  goto LAB_00115134;
LAB_001160c4:
  pcVar8 = (char *)&fStack_820;
  unaff_R13 = (char *)&fStack_930;
  pfVar7 = (fdb_config *)auStack_978;
  pfStack_988 = (fdb_config *)0x1160c9;
  multi_kv_custom_cmp_test();
LAB_001160c9:
  pfStack_988 = (fdb_config *)0x1160d6;
  multi_kv_custom_cmp_test();
  fconfig = (code *)pfVar6;
LAB_001160d6:
  pfStack_988 = (fdb_config *)0x1160db;
  multi_kv_custom_cmp_test();
LAB_001160db:
  pfStack_988 = (fdb_config *)0x1160e8;
  multi_kv_custom_cmp_test();
  pfVar6 = (fdb_config *)fconfig;
LAB_001160e8:
  pfStack_988 = (fdb_config *)0x1160ed;
  multi_kv_custom_cmp_test();
LAB_001160ed:
  pfStack_988 = (fdb_config *)0x1160fa;
  multi_kv_custom_cmp_test();
  fconfig = (code *)pfVar6;
LAB_001160fa:
  pfStack_988 = (fdb_config *)0x1160ff;
  multi_kv_custom_cmp_test();
LAB_001160ff:
  pfStack_988 = (fdb_config *)0x11610c;
  multi_kv_custom_cmp_test();
  pfVar6 = (fdb_config *)fconfig;
LAB_0011610c:
  fconfig = (code *)pfVar6;
  pfStack_988 = (fdb_config *)0x116111;
  multi_kv_custom_cmp_test();
LAB_00116111:
  pfStack_988 = (fdb_config *)0x116116;
  multi_kv_custom_cmp_test();
LAB_00116116:
  pfStack_988 = (fdb_config *)0x116123;
  multi_kv_custom_cmp_test();
  pcVar5 = (char *)pfVar7;
LAB_00116123:
  pfStack_988 = (fdb_config *)0x116128;
  multi_kv_custom_cmp_test();
LAB_00116128:
  pfStack_988 = (fdb_config *)0x116135;
  multi_kv_custom_cmp_test();
  pcVar4 = pcVar5;
LAB_00116135:
  pfStack_988 = (fdb_config *)0x11613a;
  multi_kv_custom_cmp_test();
LAB_0011613a:
  pfStack_988 = (fdb_config *)0x116147;
  multi_kv_custom_cmp_test();
  pcVar5 = pcVar4;
LAB_00116147:
  pfStack_988 = (fdb_config *)0x11614c;
  multi_kv_custom_cmp_test();
LAB_0011614c:
  pfStack_988 = (fdb_config *)0x116151;
  multi_kv_custom_cmp_test();
LAB_00116151:
  pfStack_988 = (fdb_config *)0x116156;
  multi_kv_custom_cmp_test();
LAB_00116156:
  pfStack_988 = (fdb_config *)0x11615b;
  multi_kv_custom_cmp_test();
LAB_0011615b:
  pfStack_988 = (fdb_config *)0x116168;
  multi_kv_custom_cmp_test();
  pfVar7 = (fdb_config *)pcVar5;
LAB_00116168:
  pfStack_988 = (fdb_config *)0x11616d;
  multi_kv_custom_cmp_test();
LAB_0011616d:
  pfStack_988 = (fdb_config *)0x11617a;
  multi_kv_custom_cmp_test();
  pcVar4 = (char *)pfVar7;
LAB_0011617a:
  pfStack_988 = (fdb_config *)0x11617f;
  multi_kv_custom_cmp_test();
LAB_0011617f:
  pfStack_988 = (fdb_config *)0x11618c;
  multi_kv_custom_cmp_test();
  pfVar7 = (fdb_config *)pcVar4;
LAB_0011618c:
  pfStack_988 = (fdb_config *)0x116191;
  multi_kv_custom_cmp_test();
LAB_00116191:
  pfStack_988 = (fdb_config *)0x11619e;
  multi_kv_custom_cmp_test();
  pfVar6 = pfVar7;
LAB_0011619e:
  pfStack_988 = (fdb_config *)0x1161a3;
  multi_kv_custom_cmp_test();
LAB_001161a3:
  pfStack_988 = (fdb_config *)0x1161b0;
  multi_kv_custom_cmp_test();
  pcVar4 = (char *)pfVar6;
LAB_001161b0:
  pfStack_988 = (fdb_config *)0x1161b5;
  multi_kv_custom_cmp_test();
LAB_001161b5:
  pfStack_988 = (fdb_config *)0x1161c2;
  multi_kv_custom_cmp_test();
  pfVar6 = (fdb_config *)pcVar4;
LAB_001161c2:
  pcVar4 = (char *)pfVar6;
  pfStack_988 = (fdb_config *)0x1161c7;
  multi_kv_custom_cmp_test();
LAB_001161c7:
  pfStack_988 = (fdb_config *)0x1161cc;
  multi_kv_custom_cmp_test();
LAB_001161cc:
  pfStack_988 = (fdb_config *)0x1161dc;
  multi_kv_custom_cmp_test();
LAB_001161dc:
  pfStack_988 = (fdb_config *)0x1161e9;
  multi_kv_custom_cmp_test();
  goto LAB_001161e9;
LAB_001168ed:
  pfStack_d60 = (fdb_config *)0x1168f2;
  multi_kv_fdb_open_custom_cmp_test();
LAB_001168f2:
  pfStack_d60 = (fdb_config *)0x1168f7;
  multi_kv_fdb_open_custom_cmp_test();
LAB_001168f7:
  pfStack_d60 = (fdb_config *)0x116907;
  multi_kv_fdb_open_custom_cmp_test();
  doc_00 = (fdb_doc *)pcVar10;
LAB_00116907:
  pfStack_d60 = (fdb_config *)0x11690c;
  multi_kv_fdb_open_custom_cmp_test();
LAB_0011690c:
  pfStack_d60 = (fdb_config *)0x11691c;
  multi_kv_fdb_open_custom_cmp_test();
  pcVar8 = (char *)doc_00;
LAB_0011691c:
  pfStack_d60 = (fdb_config *)0x116921;
  multi_kv_fdb_open_custom_cmp_test();
LAB_00116921:
  pfStack_d60 = (fdb_config *)0x116931;
  multi_kv_fdb_open_custom_cmp_test();
  doc_00 = (fdb_doc *)pcVar8;
LAB_00116931:
  functions_00 = ap_Stack_ab8;
  unaff_R13 = (char *)&fStack_cb8;
  pcVar4 = auStack_d48;
  pfStack_d60 = (fdb_config *)0x116936;
  multi_kv_fdb_open_custom_cmp_test();
  goto LAB_00116936;
LAB_00116e71:
  pfStackY_10e8 = (fdb_config *)0x116e7e;
  multi_kv_use_existing_mode_test();
  pfVar11 = pfVar6;
LAB_00116e7e:
  pfVar6 = pfVar11;
  pfStackY_10e8 = (fdb_config *)0x116e83;
  multi_kv_use_existing_mode_test();
LAB_00116e83:
  pfStackY_10e8 = (fdb_config *)0x116e88;
  multi_kv_use_existing_mode_test();
LAB_00116e88:
  pfStackY_10e8 = (fdb_config *)0x116e95;
  multi_kv_use_existing_mode_test();
  pfVar11 = pfVar6;
LAB_00116e95:
  functions_00 = ap_Stack_e90;
  pfStackY_10e8 = (fdb_config *)0x116e9a;
  multi_kv_use_existing_mode_test();
  goto LAB_00116e9a;
LAB_00114f8e:
  pfStack_3f0 = (fdb_config *)0x114f93;
  multi_kv_rollback_test();
LAB_00114f93:
  pfStack_3f0 = (fdb_config *)0x114f98;
  multi_kv_rollback_test();
LAB_00114f98:
  pfStack_3f0 = (fdb_config *)0x114f9d;
  multi_kv_rollback_test();
LAB_00114f9d:
  pfStack_3f0 = (fdb_config *)0x114fa2;
  multi_kv_rollback_test();
LAB_00114fa2:
  pfStack_3f0 = (fdb_config *)0x114fa7;
  multi_kv_rollback_test();
LAB_00114fa7:
  pfStack_3f0 = (fdb_config *)0x114fac;
  multi_kv_rollback_test();
LAB_00114fac:
  pfStack_3f0 = (fdb_config *)0x114fb1;
  multi_kv_rollback_test();
LAB_00114fb1:
  pfStack_3f0 = (fdb_config *)0x114fb6;
  multi_kv_rollback_test();
LAB_00114fb6:
  pcVar4 = (char *)&local_338;
  pcVar5 = "value%08d(%s)";
  pfStack_3f0 = (fdb_config *)0x114fbb;
  multi_kv_rollback_test();
LAB_00114fbb:
  pfStack_3f0 = (fdb_config *)0x114fcb;
  multi_kv_rollback_test();
  pfVar7 = unaff_R12;
LAB_00114fcb:
  pfStack_3f0 = (fdb_config *)0x114fd0;
  multi_kv_rollback_test();
LAB_00114fd0:
  pfStack_3f0 = (fdb_config *)0x114fe0;
  multi_kv_rollback_test();
  pcVar10 = (char *)pfVar7;
LAB_00114fe0:
  pfStack_3f0 = (fdb_config *)0x114fe5;
  multi_kv_rollback_test();
LAB_00114fe5:
  pfStack_3f0 = (fdb_config *)0x114ff5;
  multi_kv_rollback_test();
  pfVar7 = (fdb_config *)pcVar10;
LAB_00114ff5:
  pfStack_3f0 = (fdb_config *)0x114ffa;
  multi_kv_rollback_test();
LAB_00114ffa:
  pfStack_3f0 = (fdb_config *)0x11500a;
  multi_kv_rollback_test();
  pfVar6 = pfVar7;
LAB_0011500a:
  pfStack_3f0 = (fdb_config *)0x11500f;
  multi_kv_rollback_test();
LAB_0011500f:
  pfStack_3f0 = (fdb_config *)0x11501f;
  multi_kv_rollback_test();
  pcVar10 = (char *)pfVar6;
LAB_0011501f:
  pfStack_3f0 = (fdb_config *)0x115024;
  multi_kv_rollback_test();
LAB_00115024:
  pfStack_3f0 = (fdb_config *)0x115034;
  multi_kv_rollback_test();
  pfVar6 = (fdb_config *)pcVar10;
LAB_00115034:
  pfStack_3f0 = (fdb_config *)0x115039;
  multi_kv_rollback_test();
LAB_00115039:
  pfStack_3f0 = (fdb_config *)0x115049;
  multi_kv_rollback_test();
  pfVar7 = pfVar6;
LAB_00115049:
  pfStack_3f0 = (fdb_config *)0x11504e;
  multi_kv_rollback_test();
LAB_0011504e:
  pfStack_3f0 = (fdb_config *)0x11505e;
  multi_kv_rollback_test();
  pcVar10 = (char *)pfVar7;
LAB_0011505e:
  pfStack_3f0 = (fdb_config *)0x115063;
  multi_kv_rollback_test();
LAB_00115063:
  pfStack_3f0 = (fdb_config *)0x115073;
  multi_kv_rollback_test();
  pfVar7 = (fdb_config *)pcVar10;
LAB_00115073:
  pfStack_3f0 = (fdb_config *)0x115078;
  multi_kv_rollback_test();
LAB_00115078:
  pfStack_3f0 = (fdb_config *)0x115088;
  multi_kv_rollback_test();
  unaff_R12 = pfVar7;
LAB_00115088:
  pfStack_3f0 = (fdb_config *)0x11508d;
  multi_kv_rollback_test();
LAB_0011508d:
  pfStack_3f0 = (fdb_config *)0x11509d;
  multi_kv_rollback_test();
  pcVar10 = (char *)unaff_R12;
LAB_0011509d:
  pfStack_3f0 = (fdb_config *)0x1150a2;
  multi_kv_rollback_test();
LAB_001150a2:
  pfStack_3f0 = (fdb_config *)0x1150b2;
  multi_kv_rollback_test();
  unaff_R12 = (fdb_config *)pcVar10;
LAB_001150b2:
  pfStack_3f0 = (fdb_config *)0x1150b7;
  multi_kv_rollback_test();
LAB_001150b7:
  pfStack_3f0 = (fdb_config *)0x1150bc;
  multi_kv_rollback_test();
LAB_001150bc:
  pfStack_3f0 = (fdb_config *)0x1150c1;
  multi_kv_rollback_test();
LAB_001150c1:
  pfStack_3f0 = (fdb_config *)0x1150c6;
  multi_kv_rollback_test();
LAB_001150c6:
  pfStack_3f0 = (fdb_config *)0x1150cb;
  multi_kv_rollback_test();
LAB_001150cb:
  pfStack_3f0 = (fdb_config *)0x1150d0;
  multi_kv_rollback_test();
LAB_001150d0:
  pfStack_3f0 = (fdb_config *)0x1150d5;
  multi_kv_rollback_test();
LAB_001150d5:
  pfStack_3f0 = (fdb_config *)0x1150da;
  multi_kv_rollback_test();
LAB_001150da:
  pfStack_3f0 = (fdb_config *)0x1150df;
  multi_kv_rollback_test();
  chunksize = (size_t)pcVar5;
LAB_001150df:
  pfStack_3f0 = (fdb_config *)0x1150e4;
  multi_kv_rollback_test();
LAB_001150e4:
  pfStack_3f0 = (fdb_config *)0x1150e9;
  multi_kv_rollback_test();
  pcVar5 = (char *)chunksize;
  pcVar10 = (char *)unaff_R12;
LAB_001150e9:
  pfStack_3f0 = (fdb_config *)0x1150ee;
  multi_kv_rollback_test();
LAB_001150ee:
  pfStack_3f0 = (fdb_config *)0x1150f3;
  multi_kv_rollback_test();
LAB_001150f3:
  pfStack_3f0 = (fdb_config *)0x1150f8;
  multi_kv_rollback_test();
LAB_001150f8:
  pfStack_3f0 = (fdb_config *)0x1150fd;
  multi_kv_rollback_test();
LAB_001150fd:
  pfStack_3f0 = (fdb_config *)0x115102;
  multi_kv_rollback_test();
LAB_00115102:
  pfStack_3f0 = (fdb_config *)0x115107;
  multi_kv_rollback_test();
LAB_00115107:
  pfStack_3f0 = (fdb_config *)0x11510c;
  multi_kv_rollback_test();
LAB_0011510c:
  pfStack_3f0 = (fdb_config *)0x115111;
  multi_kv_rollback_test();
LAB_00115111:
  pfStack_3f0 = (fdb_config *)0x115116;
  multi_kv_rollback_test();
LAB_00115116:
  pfStack_3f0 = (fdb_config *)0x11511b;
  multi_kv_rollback_test();
LAB_0011511b:
  pfStack_3f0 = (fdb_config *)0x115120;
  multi_kv_rollback_test();
LAB_00115120:
  pfStack_3f0 = (fdb_config *)0x115125;
  multi_kv_rollback_test();
LAB_00115125:
  pfStack_3f0 = (fdb_config *)0x11512a;
  multi_kv_rollback_test();
LAB_0011512a:
  pfStack_3f0 = (fdb_config *)0x11512f;
  multi_kv_rollback_test();
LAB_0011512f:
  pfStack_3f0 = (fdb_config *)0x115134;
  multi_kv_rollback_test();
LAB_00115134:
  pfStack_3f0 = (fdb_config *)multi_kv_custom_cmp_test;
  multi_kv_rollback_test();
  pfStack_988 = (fdb_config *)0x115159;
  pcStack_418 = pcVar5;
  pfStack_410 = (fdb_config *)pcVar10;
  pfStack_408 = (fdb_config *)unaff_R13;
  pfStack_400 = (fdb_config *)pcVar8;
  pfStack_3f8 = pfVar11;
  pfStack_3f0 = (fdb_config *)pcVar4;
  gettimeofday(&tStack_830,(__timezone_ptr_t)0x0);
  fStack_930._0_8_ = 0x202066722d206d72;
  fStack_930.buffercache_size._0_2_ = 0x756d;
  fStack_930.buffercache_size._2_2_ = 0x746c;
  fStack_930.buffercache_size._4_3_ = 0x6b5f69;
  fStack_930.buffercache_size._7_1_ = 0x76;
  fStack_930.wal_threshold._0_7_ = 0x2a747365745f;
  pfStack_988 = (fdb_config *)0x11517b;
  system((char *)&fStack_930);
  pfStack_988 = (fdb_config *)0x115180;
  memleak_start();
  fconfig = (code *)&fStack_718;
  pfStack_988 = (fdb_config *)0x115190;
  fdb_get_default_config();
  pfStack_988 = (fdb_config *)0x11519a;
  fdb_get_default_kvs_config();
  fStack_718.seqtree_opt = '\x01';
  fStack_718.multi_kv_instances = true;
  fStack_718.wal_threshold = 0x100;
  fStack_718.wal_flush_before_commit = false;
  fStack_718.buffercache_size = 0;
  pfStack_988 = (fdb_config *)0x1151ca;
  fVar1 = fdb_open((fdb_file_handle **)(auStack_978 + 8),"./multi_kv_test",(fdb_config *)fconfig);
  if (fVar1 == FDB_RESULT_SUCCESS) {
    pfStack_988 = (fdb_config *)0x1151e8;
    fVar1 = fdb_kvs_open((fdb_file_handle *)auStack_978._8_8_,&pfStack_960,(char *)0x0,&fStack_948);
    pfVar6 = (fdb_config *)fconfig;
    pfVar7 = (fdb_config *)pcVar4;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001161ee;
    pcVar8 = (char *)&fStack_820;
    pcVar10 = "default";
    unaff_R13 = (char *)&fStack_930;
    pfVar7 = (fdb_config *)auStack_978;
    pfVar6 = (fdb_config *)0x0;
    do {
      pfStack_988 = (fdb_config *)0x11521e;
      sprintf(pcVar8,"key%06d",pfVar6);
      pfStack_988 = (fdb_config *)0x115234;
      sprintf(unaff_R13,"value%08d(%s)",pfVar6);
      pfStack_988 = (fdb_config *)0x11523c;
      sVar3 = strlen(pcVar8);
      pfVar11 = (fdb_config *)(sVar3 + 1);
      pfStack_988 = (fdb_config *)0x115248;
      sVar3 = strlen(unaff_R13);
      pfStack_988 = (fdb_config *)0x115265;
      fdb_doc_create((fdb_doc **)pfVar7,pcVar8,(size_t)pfVar11,(void *)0x0,0,unaff_R13,sVar3 + 1);
      pfStack_988 = (fdb_config *)0x115274;
      fVar1 = fdb_set(pfStack_960,(fdb_doc *)auStack_978._0_8_);
      if (fVar1 != FDB_RESULT_SUCCESS) {
        pfStack_988 = (fdb_config *)0x1160c4;
        multi_kv_custom_cmp_test();
        goto LAB_001160c4;
      }
      pfStack_988 = (fdb_config *)0x115286;
      fdb_doc_free((fdb_doc *)auStack_978._0_8_);
      uVar9 = (int)pfVar6 + 1;
      pfVar6 = (fdb_config *)(ulong)uVar9;
    } while (uVar9 != 1000);
    pfStack_988 = (fdb_config *)0x1152a0;
    fVar1 = fdb_commit((fdb_file_handle *)auStack_978._8_8_,'\0');
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001161f3;
    fStack_948.custom_cmp = _multi_kv_test_keycmp;
    pfStack_988 = (fdb_config *)0x1152ce;
    fVar1 = fdb_kvs_open((fdb_file_handle *)auStack_978._8_8_,
                         (fdb_kvs_handle **)(auStack_978 + 0x10),"kv1",&fStack_948);
    fconfig = (code *)pfVar6;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001161f8;
    pcVar8 = (char *)&fStack_820;
    pcVar10 = "kv1_custom_cmp";
    unaff_R13 = (char *)&fStack_930;
    pfVar7 = (fdb_config *)auStack_978;
    fconfig = (code *)0x0;
    do {
      pfStack_988 = (fdb_config *)0x115304;
      sprintf(pcVar8,"key%06d",fconfig);
      pfStack_988 = (fdb_config *)0x11531a;
      sprintf(unaff_R13,"value%08d(%s)",fconfig);
      pfStack_988 = (fdb_config *)0x115322;
      sVar3 = strlen(pcVar8);
      pfVar11 = (fdb_config *)(sVar3 + 1);
      pfStack_988 = (fdb_config *)0x11532e;
      sVar3 = strlen(unaff_R13);
      pfStack_988 = (fdb_config *)0x11534b;
      fdb_doc_create((fdb_doc **)pfVar7,pcVar8,(size_t)pfVar11,(void *)0x0,0,unaff_R13,sVar3 + 1);
      pfStack_988 = (fdb_config *)0x11535a;
      fVar1 = fdb_set((fdb_kvs_handle *)auStack_978._16_8_,(fdb_doc *)auStack_978._0_8_);
      pfVar6 = (fdb_config *)fconfig;
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001160c4;
      pfStack_988 = (fdb_config *)0x11536c;
      fdb_doc_free((fdb_doc *)auStack_978._0_8_);
      uVar9 = (int)fconfig + 1;
      fconfig = (code *)(ulong)uVar9;
    } while (uVar9 != 1000);
    pfStack_988 = (fdb_config *)0x115386;
    fVar1 = fdb_commit((fdb_file_handle *)auStack_978._8_8_,'\0');
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001161fd;
    pfVar11 = &fStack_820;
    pfVar7 = &fStack_930;
    pcVar8 = auStack_978;
    unaff_R13 = (char *)0x0;
    do {
      pfStack_988 = (fdb_config *)0x1153b7;
      sprintf((char *)pfVar11,"key%06d",unaff_R13);
      pfStack_988 = (fdb_config *)0x1153d2;
      sprintf((char *)pfVar7,"value%08d(%s)",unaff_R13);
      pfStack_988 = (fdb_config *)0x1153da;
      sVar3 = strlen((char *)pfVar11);
      pfStack_988 = (fdb_config *)0x1153f9;
      fdb_doc_create((fdb_doc **)pcVar8,pfVar11,sVar3 + 1,(void *)0x0,0,(void *)0x0,0);
      pfStack_988 = (fdb_config *)0x115408;
      fVar1 = fdb_get(pfStack_960,(fdb_doc *)auStack_978._0_8_);
      pfVar6 = (fdb_config *)auStack_978._0_8_;
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001160d6;
      pcVar10 = *(char **)(auStack_978._0_8_ + 0x40);
      pfStack_988 = (fdb_config *)0x115428;
      iVar2 = bcmp(pfVar7,pcVar10,*(uint64_t *)(auStack_978._0_8_ + 0x10));
      if (iVar2 != 0) goto LAB_001160c9;
      pfStack_988 = (fdb_config *)0x115438;
      fdb_doc_free((fdb_doc *)pfVar6);
      pfStack_988 = (fdb_config *)0x115453;
      sprintf((char *)pfVar7,"value%08d(%s)",unaff_R13);
      pfStack_988 = (fdb_config *)0x11545b;
      sVar3 = strlen((char *)pfVar11);
      pfStack_988 = (fdb_config *)0x11547a;
      fdb_doc_create((fdb_doc **)pcVar8,pfVar11,sVar3 + 1,(void *)0x0,0,(void *)0x0,0);
      pfStack_988 = (fdb_config *)0x115489;
      fVar1 = fdb_get((fdb_kvs_handle *)auStack_978._16_8_,(fdb_doc *)auStack_978._0_8_);
      fconfig = (code *)auStack_978._0_8_;
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001160e8;
      pcVar10 = *(char **)(auStack_978._0_8_ + 0x40);
      pfStack_988 = (fdb_config *)0x1154a9;
      iVar2 = bcmp(pfVar7,pcVar10,*(uint64_t *)(auStack_978._0_8_ + 0x10));
      if (iVar2 != 0) goto LAB_001160db;
      pfStack_988 = (fdb_config *)0x1154b9;
      fdb_doc_free((fdb_doc *)fconfig);
      uVar9 = (int)unaff_R13 + 1;
      unaff_R13 = (char *)(ulong)uVar9;
    } while (uVar9 != 1000);
    pfStack_988 = (fdb_config *)0x1154d3;
    fVar1 = fdb_close((fdb_file_handle *)auStack_978._8_8_);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116202;
    fStack_948.custom_cmp = (fdb_custom_cmp_variable)0x0;
    pfStack_988 = (fdb_config *)0x1154fd;
    fVar1 = fdb_open((fdb_file_handle **)(auStack_978 + 8),"./multi_kv_test",&fStack_718);
    fconfig = _multi_kv_test_keycmp;
    if (fVar1 == FDB_RESULT_SUCCESS) goto LAB_00116207;
    apcStack_520[0] = (char *)0x0;
    ap_Stack_620[0] = _multi_kv_test_keycmp;
    pfStack_988 = (fdb_config *)0x115546;
    fVar1 = fdb_open_custom_cmp((fdb_file_handle **)(auStack_978 + 8),"./multi_kv_test",&fStack_718,
                                1,apcStack_520,ap_Stack_620,(void **)0x0);
    if (fVar1 == FDB_RESULT_SUCCESS) goto LAB_0011620c;
    apcStack_520[0] = "kv1";
    ap_Stack_620[0] = _multi_kv_test_keycmp;
    pfStack_988 = (fdb_config *)0x115591;
    fVar1 = fdb_open_custom_cmp((fdb_file_handle **)(auStack_978 + 8),"./multi_kv_test",&fStack_718,
                                1,apcStack_520,ap_Stack_620,(void **)0x0);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116211;
    pfStack_988 = (fdb_config *)0x1155af;
    fVar1 = fdb_kvs_open((fdb_file_handle *)auStack_978._8_8_,&pfStack_960,(char *)0x0,&fStack_948);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116216;
    pfStack_988 = (fdb_config *)0x1155d2;
    fVar1 = fdb_kvs_open((fdb_file_handle *)auStack_978._8_8_,
                         (fdb_kvs_handle **)(auStack_978 + 0x10),"kv1",&fStack_948);
    pcVar4 = (char *)pfVar7;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011621b;
    pcVar8 = (char *)&fStack_820;
    unaff_R13 = (char *)&fStack_930;
    pfVar7 = (fdb_config *)auStack_978;
    pcVar10 = (char *)0x0;
    do {
      pfStack_988 = (fdb_config *)0x115603;
      sprintf(pcVar8,"key%06d",pcVar10);
      pfStack_988 = (fdb_config *)0x11561e;
      sprintf(unaff_R13,"value%08d(%s)",pcVar10);
      pfStack_988 = (fdb_config *)0x115626;
      sVar3 = strlen(pcVar8);
      pfStack_988 = (fdb_config *)0x115645;
      fdb_doc_create((fdb_doc **)pfVar7,pcVar8,sVar3 + 1,(void *)0x0,0,(void *)0x0,0);
      pfStack_988 = (fdb_config *)0x115654;
      fVar1 = fdb_get(pfStack_960,(fdb_doc *)auStack_978._0_8_);
      pfVar6 = (fdb_config *)auStack_978._0_8_;
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001160fa;
      pfVar11 = *(fdb_config **)(auStack_978._0_8_ + 0x40);
      pfStack_988 = (fdb_config *)0x115674;
      iVar2 = bcmp(unaff_R13,pfVar11,*(uint64_t *)(auStack_978._0_8_ + 0x10));
      if (iVar2 != 0) goto LAB_001160ed;
      pfStack_988 = (fdb_config *)0x115684;
      fdb_doc_free((fdb_doc *)pfVar6);
      pfStack_988 = (fdb_config *)0x11569f;
      sprintf(unaff_R13,"value%08d(%s)",pcVar10);
      pfStack_988 = (fdb_config *)0x1156a7;
      sVar3 = strlen(pcVar8);
      pfStack_988 = (fdb_config *)0x1156c6;
      fdb_doc_create((fdb_doc **)pfVar7,pcVar8,sVar3 + 1,(void *)0x0,0,(void *)0x0,0);
      pfStack_988 = (fdb_config *)0x1156d5;
      fVar1 = fdb_get((fdb_kvs_handle *)auStack_978._16_8_,(fdb_doc *)auStack_978._0_8_);
      fconfig = (code *)auStack_978._0_8_;
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011610c;
      pfVar11 = *(fdb_config **)(auStack_978._0_8_ + 0x40);
      pfStack_988 = (fdb_config *)0x1156f5;
      iVar2 = bcmp(unaff_R13,pfVar11,*(uint64_t *)(auStack_978._0_8_ + 0x10));
      if (iVar2 != 0) goto LAB_001160ff;
      pfStack_988 = (fdb_config *)0x115705;
      fdb_doc_free((fdb_doc *)fconfig);
      uVar9 = (int)pcVar10 + 1;
      pcVar10 = (char *)(ulong)uVar9;
    } while (uVar9 != 1000);
    fStack_948.custom_cmp = (fdb_custom_cmp_variable)0x0;
    pfStack_988 = (fdb_config *)0x115738;
    fVar1 = fdb_kvs_open((fdb_file_handle *)auStack_978._8_8_,&pfStack_958,"kv2",&fStack_948);
    pcVar4 = (char *)pfVar7;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116220;
    pcVar8 = (char *)&fStack_820;
    pcVar10 = "kv2";
    unaff_R13 = (char *)&fStack_930;
    pcVar4 = auStack_978;
    fconfig = (code *)0x0;
    do {
      pfStack_988 = (fdb_config *)0x11576e;
      sprintf(pcVar8,"key%06d",fconfig);
      pfStack_988 = (fdb_config *)0x115784;
      sprintf(unaff_R13,"value%08d(%s)",fconfig);
      pfStack_988 = (fdb_config *)0x11578c;
      sVar3 = strlen(pcVar8);
      pfVar11 = (fdb_config *)(sVar3 + 1);
      pfStack_988 = (fdb_config *)0x115798;
      sVar3 = strlen(unaff_R13);
      pfStack_988 = (fdb_config *)0x1157b5;
      fdb_doc_create((fdb_doc **)pcVar4,pcVar8,(size_t)pfVar11,(void *)0x0,0,unaff_R13,sVar3 + 1);
      pfStack_988 = (fdb_config *)0x1157c4;
      fVar1 = fdb_set(pfStack_958,(fdb_doc *)auStack_978._0_8_);
      pfVar7 = (fdb_config *)pcVar4;
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116111;
      pfStack_988 = (fdb_config *)0x1157d6;
      fdb_doc_free((fdb_doc *)auStack_978._0_8_);
      uVar9 = (int)fconfig + 1;
      fconfig = (code *)(ulong)uVar9;
    } while (uVar9 != 1000);
    pfStack_988 = (fdb_config *)0x1157f0;
    fVar1 = fdb_commit((fdb_file_handle *)auStack_978._8_8_,'\0');
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116225;
    pcVar10 = (char *)&fStack_820;
    fconfig = (code *)&fStack_930;
    pcVar8 = auStack_978;
    pfVar11 = (fdb_config *)0x0;
    do {
      pfStack_988 = (fdb_config *)0x115821;
      sprintf(pcVar10,"key%06d",pfVar11);
      pfStack_988 = (fdb_config *)0x11583c;
      sprintf((char *)fconfig,"value%08d(%s)",pfVar11);
      pfStack_988 = (fdb_config *)0x115844;
      sVar3 = strlen(pcVar10);
      pfStack_988 = (fdb_config *)0x115863;
      fdb_doc_create((fdb_doc **)pcVar8,pcVar10,sVar3 + 1,(void *)0x0,0,(void *)0x0,0);
      pfStack_988 = (fdb_config *)0x115872;
      fVar1 = fdb_get(pfStack_960,(fdb_doc *)auStack_978._0_8_);
      pfVar7 = (fdb_config *)auStack_978._0_8_;
      pcVar5 = pcVar4;
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116123;
      unaff_R13 = *(char **)(auStack_978._0_8_ + 0x40);
      pfStack_988 = (fdb_config *)0x115892;
      iVar2 = bcmp(fconfig,unaff_R13,*(uint64_t *)(auStack_978._0_8_ + 0x10));
      if (iVar2 != 0) goto LAB_00116116;
      pfStack_988 = (fdb_config *)0x1158a2;
      fdb_doc_free((fdb_doc *)pfVar7);
      pfStack_988 = (fdb_config *)0x1158bd;
      sprintf((char *)fconfig,"value%08d(%s)",pfVar11);
      pfStack_988 = (fdb_config *)0x1158c5;
      sVar3 = strlen(pcVar10);
      pfStack_988 = (fdb_config *)0x1158e4;
      fdb_doc_create((fdb_doc **)pcVar8,pcVar10,sVar3 + 1,(void *)0x0,0,(void *)0x0,0);
      pfStack_988 = (fdb_config *)0x1158f3;
      fVar1 = fdb_get((fdb_kvs_handle *)auStack_978._16_8_,(fdb_doc *)auStack_978._0_8_);
      pcVar5 = (char *)auStack_978._0_8_;
      pcVar4 = (char *)pfVar7;
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116135;
      unaff_R13 = *(char **)(auStack_978._0_8_ + 0x40);
      pfStack_988 = (fdb_config *)0x115913;
      iVar2 = bcmp(fconfig,unaff_R13,*(uint64_t *)(auStack_978._0_8_ + 0x10));
      if (iVar2 != 0) goto LAB_00116128;
      pfStack_988 = (fdb_config *)0x115923;
      fdb_doc_free((fdb_doc *)pcVar5);
      pfStack_988 = (fdb_config *)0x11593e;
      sprintf((char *)fconfig,"value%08d(%s)",pfVar11);
      pfStack_988 = (fdb_config *)0x115946;
      sVar3 = strlen(pcVar10);
      pfStack_988 = (fdb_config *)0x115965;
      fdb_doc_create((fdb_doc **)pcVar8,pcVar10,sVar3 + 1,(void *)0x0,0,(void *)0x0,0);
      pfStack_988 = (fdb_config *)0x115974;
      fVar1 = fdb_get(pfStack_958,(fdb_doc *)auStack_978._0_8_);
      pcVar4 = (char *)auStack_978._0_8_;
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116147;
      unaff_R13 = *(char **)(auStack_978._0_8_ + 0x40);
      pfStack_988 = (fdb_config *)0x115994;
      iVar2 = bcmp(fconfig,unaff_R13,*(uint64_t *)(auStack_978._0_8_ + 0x10));
      if (iVar2 != 0) goto LAB_0011613a;
      pfStack_988 = (fdb_config *)0x1159a4;
      fdb_doc_free((fdb_doc *)pcVar4);
      uVar9 = (int)pfVar11 + 1;
      pfVar11 = (fdb_config *)(ulong)uVar9;
    } while (uVar9 != 1000);
    unaff_R13 = (char *)&fStack_820;
    pfVar11 = &fStack_930;
    pcVar10 = (char *)0x0;
    do {
      pcVar8 = auStack_978;
      pfStack_988 = (fdb_config *)0x1159e0;
      sprintf(unaff_R13,"key%06d",pcVar10);
      pcVar5 = "value%08d(%s)";
      pfStack_988 = (fdb_config *)0x1159fe;
      sprintf((char *)pfVar11,"value%08d(%s)",pcVar10);
      pfStack_988 = (fdb_config *)0x115a06;
      sVar3 = strlen(unaff_R13);
      fconfig = (code *)(sVar3 + 1);
      pfStack_988 = (fdb_config *)0x115a12;
      sVar3 = strlen((char *)pfVar11);
      pfStack_988 = (fdb_config *)0x115a2f;
      fdb_doc_create((fdb_doc **)pcVar8,unaff_R13,(size_t)fconfig,(void *)0x0,0,pfVar11,sVar3 + 1);
      pfStack_988 = (fdb_config *)0x115a3e;
      fVar1 = fdb_set(pfStack_960,(fdb_doc *)auStack_978._0_8_);
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011614c;
      pfStack_988 = (fdb_config *)0x115a50;
      fdb_doc_free((fdb_doc *)auStack_978._0_8_);
      pcVar8 = "key%06d";
      pfStack_988 = (fdb_config *)0x115a67;
      sprintf(unaff_R13,"key%06d",pcVar10);
      pfStack_988 = (fdb_config *)0x115a7e;
      sprintf((char *)pfVar11,"value%08d(%s)",pcVar10);
      pfStack_988 = (fdb_config *)0x115a86;
      sVar3 = strlen(unaff_R13);
      fconfig = (code *)(sVar3 + 1);
      pfStack_988 = (fdb_config *)0x115a92;
      sVar3 = strlen((char *)pfVar11);
      pfStack_988 = (fdb_config *)0x115ab1;
      fdb_doc_create((fdb_doc **)auStack_978,unaff_R13,(size_t)fconfig,(void *)0x0,0,pfVar11,
                     sVar3 + 1);
      pfStack_988 = (fdb_config *)0x115ac0;
      fVar1 = fdb_set((fdb_kvs_handle *)auStack_978._16_8_,(fdb_doc *)auStack_978._0_8_);
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116151;
      pfStack_988 = (fdb_config *)0x115ad2;
      fdb_doc_free((fdb_doc *)auStack_978._0_8_);
      pcVar4 = "key%06d";
      pfStack_988 = (fdb_config *)0x115ae8;
      sprintf(unaff_R13,"key%06d",pcVar10);
      pfStack_988 = (fdb_config *)0x115aff;
      sprintf((char *)pfVar11,"value%08d(%s)",pcVar10);
      pfStack_988 = (fdb_config *)0x115b07;
      sVar3 = strlen(unaff_R13);
      fconfig = (code *)(sVar3 + 1);
      pfStack_988 = (fdb_config *)0x115b13;
      sVar3 = strlen((char *)pfVar11);
      pcVar8 = auStack_978;
      pfStack_988 = (fdb_config *)0x115b35;
      fdb_doc_create((fdb_doc **)pcVar8,unaff_R13,(size_t)fconfig,(void *)0x0,0,pfVar11,sVar3 + 1);
      pfStack_988 = (fdb_config *)0x115b44;
      fVar1 = fdb_set(pfStack_958,(fdb_doc *)auStack_978._0_8_);
      pcVar5 = pcVar4;
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116156;
      pfStack_988 = (fdb_config *)0x115b56;
      fdb_doc_free((fdb_doc *)auStack_978._0_8_);
      uVar9 = (int)pcVar10 + 1;
      pcVar10 = (char *)(ulong)uVar9;
    } while (uVar9 != 1000);
    pfStack_988 = (fdb_config *)0x115b72;
    fVar1 = fdb_commit((fdb_file_handle *)auStack_978._8_8_,'\0');
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011622a;
    pcVar10 = (char *)&fStack_820;
    fconfig = (code *)&fStack_930;
    pcVar8 = auStack_978;
    pfVar11 = (fdb_config *)0x0;
    do {
      pfStack_988 = (fdb_config *)0x115ba3;
      sprintf(pcVar10,"key%06d",pfVar11);
      pfStack_988 = (fdb_config *)0x115bbe;
      sprintf((char *)fconfig,"value%08d(%s)",pfVar11);
      pfStack_988 = (fdb_config *)0x115bc6;
      sVar3 = strlen(pcVar10);
      pfStack_988 = (fdb_config *)0x115be5;
      fdb_doc_create((fdb_doc **)pcVar8,pcVar10,sVar3 + 1,(void *)0x0,0,(void *)0x0,0);
      pfStack_988 = (fdb_config *)0x115bf4;
      fVar1 = fdb_get(pfStack_960,(fdb_doc *)auStack_978._0_8_);
      pcVar5 = (char *)auStack_978._0_8_;
      pfVar7 = (fdb_config *)pcVar4;
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116168;
      unaff_R13 = *(char **)(auStack_978._0_8_ + 0x40);
      pfStack_988 = (fdb_config *)0x115c14;
      iVar2 = bcmp(fconfig,unaff_R13,*(uint64_t *)(auStack_978._0_8_ + 0x10));
      if (iVar2 != 0) goto LAB_0011615b;
      pfStack_988 = (fdb_config *)0x115c24;
      fdb_doc_free((fdb_doc *)pcVar5);
      pfStack_988 = (fdb_config *)0x115c3f;
      sprintf((char *)fconfig,"value%08d(%s)",pfVar11);
      pfStack_988 = (fdb_config *)0x115c47;
      sVar3 = strlen(pcVar10);
      pfStack_988 = (fdb_config *)0x115c66;
      fdb_doc_create((fdb_doc **)pcVar8,pcVar10,sVar3 + 1,(void *)0x0,0,(void *)0x0,0);
      pfStack_988 = (fdb_config *)0x115c75;
      fVar1 = fdb_get((fdb_kvs_handle *)auStack_978._16_8_,(fdb_doc *)auStack_978._0_8_);
      pfVar7 = (fdb_config *)auStack_978._0_8_;
      pcVar4 = pcVar5;
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011617a;
      unaff_R13 = *(char **)(auStack_978._0_8_ + 0x40);
      pfStack_988 = (fdb_config *)0x115c95;
      iVar2 = bcmp(fconfig,unaff_R13,*(uint64_t *)(auStack_978._0_8_ + 0x10));
      if (iVar2 != 0) goto LAB_0011616d;
      pfStack_988 = (fdb_config *)0x115ca5;
      fdb_doc_free((fdb_doc *)pfVar7);
      pfStack_988 = (fdb_config *)0x115cc0;
      sprintf((char *)fconfig,"value%08d(%s)",pfVar11);
      pfStack_988 = (fdb_config *)0x115cc8;
      sVar3 = strlen(pcVar10);
      pfStack_988 = (fdb_config *)0x115ce7;
      fdb_doc_create((fdb_doc **)pcVar8,pcVar10,sVar3 + 1,(void *)0x0,0,(void *)0x0,0);
      pfStack_988 = (fdb_config *)0x115cf6;
      fVar1 = fdb_get(pfStack_958,(fdb_doc *)auStack_978._0_8_);
      pcVar4 = (char *)auStack_978._0_8_;
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011618c;
      unaff_R13 = *(char **)(auStack_978._0_8_ + 0x40);
      pfStack_988 = (fdb_config *)0x115d16;
      iVar2 = bcmp(fconfig,unaff_R13,*(uint64_t *)(auStack_978._0_8_ + 0x10));
      if (iVar2 != 0) goto LAB_0011617f;
      pfStack_988 = (fdb_config *)0x115d26;
      fdb_doc_free((fdb_doc *)pcVar4);
      uVar9 = (int)pfVar11 + 1;
      pfVar11 = (fdb_config *)(ulong)uVar9;
    } while (uVar9 != 1000);
    pfStack_988 = (fdb_config *)0x115d47;
    fVar1 = fdb_compact((fdb_file_handle *)auStack_978._8_8_,"./multi_kv_test2");
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011622f;
    pcVar10 = (char *)&fStack_820;
    fconfig = (code *)&fStack_930;
    pcVar8 = auStack_978;
    pfVar11 = (fdb_config *)0x0;
    do {
      pfStack_988 = (fdb_config *)0x115d78;
      sprintf(pcVar10,"key%06d",pfVar11);
      pfStack_988 = (fdb_config *)0x115d93;
      sprintf((char *)fconfig,"value%08d(%s)",pfVar11);
      pfStack_988 = (fdb_config *)0x115d9b;
      sVar3 = strlen(pcVar10);
      pfStack_988 = (fdb_config *)0x115dba;
      fdb_doc_create((fdb_doc **)pcVar8,pcVar10,sVar3 + 1,(void *)0x0,0,(void *)0x0,0);
      pfStack_988 = (fdb_config *)0x115dc9;
      fVar1 = fdb_get(pfStack_960,(fdb_doc *)auStack_978._0_8_);
      pfVar7 = (fdb_config *)auStack_978._0_8_;
      pfVar6 = (fdb_config *)pcVar4;
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011619e;
      unaff_R13 = *(char **)(auStack_978._0_8_ + 0x40);
      pfStack_988 = (fdb_config *)0x115de9;
      iVar2 = bcmp(fconfig,unaff_R13,*(uint64_t *)(auStack_978._0_8_ + 0x10));
      if (iVar2 != 0) goto LAB_00116191;
      pfStack_988 = (fdb_config *)0x115df9;
      fdb_doc_free((fdb_doc *)pfVar7);
      pfStack_988 = (fdb_config *)0x115e14;
      sprintf((char *)fconfig,"value%08d(%s)",pfVar11);
      pfStack_988 = (fdb_config *)0x115e1c;
      sVar3 = strlen(pcVar10);
      pfStack_988 = (fdb_config *)0x115e3b;
      fdb_doc_create((fdb_doc **)pcVar8,pcVar10,sVar3 + 1,(void *)0x0,0,(void *)0x0,0);
      pfStack_988 = (fdb_config *)0x115e4a;
      fVar1 = fdb_get((fdb_kvs_handle *)auStack_978._16_8_,(fdb_doc *)auStack_978._0_8_);
      pfVar6 = (fdb_config *)auStack_978._0_8_;
      pcVar4 = (char *)pfVar7;
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001161b0;
      unaff_R13 = *(char **)(auStack_978._0_8_ + 0x40);
      pfStack_988 = (fdb_config *)0x115e6a;
      iVar2 = bcmp(fconfig,unaff_R13,*(uint64_t *)(auStack_978._0_8_ + 0x10));
      if (iVar2 != 0) goto LAB_001161a3;
      pfStack_988 = (fdb_config *)0x115e7a;
      fdb_doc_free((fdb_doc *)pfVar6);
      pfStack_988 = (fdb_config *)0x115e95;
      sprintf((char *)fconfig,"value%08d(%s)",pfVar11);
      pfStack_988 = (fdb_config *)0x115e9d;
      sVar3 = strlen(pcVar10);
      pfStack_988 = (fdb_config *)0x115ebc;
      fdb_doc_create((fdb_doc **)pcVar8,pcVar10,sVar3 + 1,(void *)0x0,0,(void *)0x0,0);
      pfStack_988 = (fdb_config *)0x115ecb;
      fVar1 = fdb_get(pfStack_958,(fdb_doc *)auStack_978._0_8_);
      pcVar4 = (char *)auStack_978._0_8_;
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001161c2;
      unaff_R13 = *(char **)(auStack_978._0_8_ + 0x40);
      pfStack_988 = (fdb_config *)0x115eeb;
      iVar2 = bcmp(fconfig,unaff_R13,*(uint64_t *)(auStack_978._0_8_ + 0x10));
      if (iVar2 != 0) goto LAB_001161b5;
      pfStack_988 = (fdb_config *)0x115efb;
      fdb_doc_free((fdb_doc *)pcVar4);
      uVar9 = (int)pfVar11 + 1;
      pfVar11 = (fdb_config *)(ulong)uVar9;
    } while (uVar9 != 1000);
    pfStack_988 = (fdb_config *)0x115f29;
    fVar1 = fdb_doc_create((fdb_doc **)auStack_978,(void *)0x0,0,(void *)0x0,0,(void *)0x0,0);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116234;
    *(char ***)(auStack_978._0_8_ + 0x20) = apcStack_520;
    *(fdb_custom_cmp_variable **)(auStack_978._0_8_ + 0x40) = ap_Stack_620;
    pfStack_988 = (fdb_config *)0x115f6e;
    fVar1 = fdb_iterator_init((fdb_kvs_handle *)auStack_978._16_8_,&pfStack_950,(void *)0x0,0,
                              (void *)0x0,0,0);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116239;
    pfVar11 = &fStack_820;
    unaff_R13 = "kv1_custom_cmp(updated)";
    fconfig = (code *)&fStack_930;
    pcVar4 = (char *)0x0;
    do {
      pfStack_988 = (fdb_config *)0x115f9b;
      fVar1 = fdb_iterator_get(pfStack_950,(fdb_doc **)auStack_978);
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001161c7;
      pfStack_988 = (fdb_config *)0x115fb6;
      sprintf((char *)pfVar11,"key%06d",pcVar4);
      pfStack_988 = (fdb_config *)0x115fcc;
      sprintf((char *)fconfig,"value%08d(%s)",pcVar4,"kv1_custom_cmp(updated)");
      pcVar10 = (char *)auStack_978._0_8_;
      pcVar8 = *(char **)(auStack_978._0_8_ + 0x20);
      pfStack_988 = (fdb_config *)0x115fe5;
      iVar2 = bcmp(pcVar8,pfVar11,*(size_t *)auStack_978._0_8_);
      if (iVar2 != 0) goto LAB_001161cc;
      pcVar8 = *(char **)((long)pcVar10 + 0x40);
      pfStack_988 = (fdb_config *)0x116002;
      iVar2 = bcmp(pcVar8,fconfig,*(uint64_t *)((long)pcVar10 + 0x10));
      if (iVar2 != 0) goto LAB_001161dc;
      uVar9 = (int)pcVar4 + 1;
      pcVar4 = (char *)(ulong)uVar9;
      pfStack_988 = (fdb_config *)0x116016;
      fVar1 = fdb_iterator_next(pfStack_950);
    } while (fVar1 == FDB_RESULT_SUCCESS);
    if (uVar9 != 1000) goto LAB_0011623e;
    pfStack_988 = (fdb_config *)0x116034;
    fVar1 = fdb_iterator_close(pfStack_950);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116243;
    pfStack_988 = (fdb_config *)0x116046;
    fVar1 = fdb_close((fdb_file_handle *)auStack_978._8_8_);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116248;
    pfStack_988 = (fdb_config *)0x116053;
    fVar1 = fdb_shutdown();
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011624d;
    *(undefined8 *)(auStack_978._0_8_ + 0x20) = 0;
    *(undefined8 *)(auStack_978._0_8_ + 0x40) = 0;
    pfStack_988 = (fdb_config *)0x11606f;
    fVar1 = fdb_doc_free((fdb_doc *)auStack_978._0_8_);
    if (fVar1 == FDB_RESULT_SUCCESS) {
      pfStack_988 = (fdb_config *)0x11607c;
      memleak_end();
      pcVar8 = "%s PASSED\n";
      if (multi_kv_custom_cmp_test()::__test_pass != '\0') {
        pcVar8 = "%s FAILED\n";
      }
      pfStack_988 = (fdb_config *)0x1160ad;
      fprintf(_stderr,pcVar8,"multiple KV instances custom comparison function test");
      return;
    }
  }
  else {
LAB_001161e9:
    pfStack_988 = (fdb_config *)0x1161ee;
    multi_kv_custom_cmp_test();
    pfVar6 = (fdb_config *)fconfig;
    pfVar7 = (fdb_config *)pcVar4;
LAB_001161ee:
    pfStack_988 = (fdb_config *)0x1161f3;
    multi_kv_custom_cmp_test();
LAB_001161f3:
    pfStack_988 = (fdb_config *)0x1161f8;
    multi_kv_custom_cmp_test();
    fconfig = (code *)pfVar6;
LAB_001161f8:
    pfStack_988 = (fdb_config *)0x1161fd;
    multi_kv_custom_cmp_test();
LAB_001161fd:
    pfStack_988 = (fdb_config *)0x116202;
    multi_kv_custom_cmp_test();
LAB_00116202:
    pfStack_988 = (fdb_config *)0x116207;
    multi_kv_custom_cmp_test();
LAB_00116207:
    pfStack_988 = (fdb_config *)0x11620c;
    multi_kv_custom_cmp_test();
LAB_0011620c:
    pfStack_988 = (fdb_config *)0x116211;
    multi_kv_custom_cmp_test();
LAB_00116211:
    pfStack_988 = (fdb_config *)0x116216;
    multi_kv_custom_cmp_test();
LAB_00116216:
    pfStack_988 = (fdb_config *)0x11621b;
    multi_kv_custom_cmp_test();
    pcVar4 = (char *)pfVar7;
LAB_0011621b:
    pfStack_988 = (fdb_config *)0x116220;
    multi_kv_custom_cmp_test();
LAB_00116220:
    pfStack_988 = (fdb_config *)0x116225;
    multi_kv_custom_cmp_test();
LAB_00116225:
    pfStack_988 = (fdb_config *)0x11622a;
    multi_kv_custom_cmp_test();
LAB_0011622a:
    pfStack_988 = (fdb_config *)0x11622f;
    multi_kv_custom_cmp_test();
LAB_0011622f:
    pfStack_988 = (fdb_config *)0x116234;
    multi_kv_custom_cmp_test();
LAB_00116234:
    pfStack_988 = (fdb_config *)0x116239;
    multi_kv_custom_cmp_test();
LAB_00116239:
    pfStack_988 = (fdb_config *)0x11623e;
    multi_kv_custom_cmp_test();
LAB_0011623e:
    pfStack_988 = (fdb_config *)0x116243;
    multi_kv_custom_cmp_test();
LAB_00116243:
    pfStack_988 = (fdb_config *)0x116248;
    multi_kv_custom_cmp_test();
LAB_00116248:
    pfStack_988 = (fdb_config *)0x11624d;
    multi_kv_custom_cmp_test();
LAB_0011624d:
    pfStack_988 = (fdb_config *)0x116252;
    multi_kv_custom_cmp_test();
  }
  pfStack_988 = (fdb_config *)multi_kv_fdb_open_custom_cmp_test;
  multi_kv_custom_cmp_test();
  doc_00 = (fdb_doc *)0x0;
  pfStack_d60 = (fdb_config *)0x11627a;
  pfStack_9b0 = (fdb_config *)fconfig;
  pfStack_9a8 = (fdb_config *)pcVar10;
  pfStack_9a0 = (fdb_config *)unaff_R13;
  pfStack_998 = (fdb_config *)pcVar8;
  pfStack_990 = pfVar11;
  pfStack_988 = (fdb_config *)pcVar4;
  gettimeofday(&tStack_cc8,(__timezone_ptr_t)0x0);
  kvs_names_00 = &pcStack_ce8;
  pcStack_cd8 = "kv2";
  pcStack_ce8 = "default";
  pcStack_ce0 = "kv1";
  functions_00 = &p_Stack_d08;
  pcStack_cf8 = (code *)0x0;
  p_Stack_d08 = _multi_kv_test_keycmp;
  pcStack_d00 = _multi_kv_test_keycmp;
  fStack_cb8.wal_threshold._0_1_ = '_';
  fStack_cb8.wal_threshold._1_1_ = 't';
  fStack_cb8.wal_threshold._2_1_ = 'e';
  fStack_cb8.wal_threshold._3_1_ = 's';
  fStack_cb8.wal_threshold._4_1_ = 't';
  fStack_cb8.wal_threshold._5_1_ = '*';
  fStack_cb8.wal_threshold._6_1_ = '\0';
  fStack_cb8._0_8_ = 0x202066722d206d72;
  fStack_cb8.buffercache_size._0_1_ = 'm';
  fStack_cb8.buffercache_size._1_1_ = 'u';
  fStack_cb8.buffercache_size._2_1_ = 'l';
  fStack_cb8.buffercache_size._3_1_ = 't';
  fStack_cb8.buffercache_size._4_1_ = 'i';
  fStack_cb8.buffercache_size._5_1_ = '_';
  fStack_cb8.buffercache_size._6_1_ = 'k';
  fStack_cb8.buffercache_size._7_1_ = 'v';
  pfStack_d60 = (fdb_config *)0x1162d4;
  system((char *)&fStack_cb8);
  pfStack_d60 = (fdb_config *)0x1162d9;
  memleak_start();
  pfVar11 = &fStack_bb0;
  pfStack_d60 = (fdb_config *)0x1162e9;
  fdb_get_default_config();
  pfStack_d60 = (fdb_config *)0x1162f3;
  fdb_get_default_kvs_config();
  fStack_bb0.seqtree_opt = '\x01';
  fStack_bb0.multi_kv_instances = true;
  fStack_bb0.wal_threshold = 0x100;
  fStack_bb0.wal_flush_before_commit = false;
  fStack_bb0.buffercache_size = 0;
  pfStack_d60 = (fdb_config *)0x116331;
  fVar1 = fdb_open_custom_cmp((fdb_file_handle **)(auStack_d48 + 8),"./multi_kv_test",pfVar11,3,
                              kvs_names_00,functions_00,(void **)0x0);
  if (fVar1 == FDB_RESULT_SUCCESS) {
    pfStack_d60 = (fdb_config *)0x11634f;
    fVar1 = fdb_kvs_open((fdb_file_handle *)auStack_d48._8_8_,&pfStack_d28,(char *)0x0,&fStack_d20);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011693b;
    pfStack_d60 = (fdb_config *)0x116372;
    fVar1 = fdb_kvs_open((fdb_file_handle *)auStack_d48._8_8_,&pfStack_d30,"kv1",&fStack_d20);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116940;
    fStack_d20.custom_cmp = _multi_kv_test_keycmp;
    pfStack_d60 = (fdb_config *)0x1163a0;
    fVar1 = fdb_kvs_open((fdb_file_handle *)auStack_d48._8_8_,
                         (fdb_kvs_handle **)(auStack_d48 + 0x10),"kv2",&fStack_d20);
    pcVar8 = (char *)doc_00;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116945;
    pcVar10 = "default";
    kvs_names_00 = (char **)0x0;
    do {
      pfStack_d60 = (fdb_config *)0x1163d9;
      sprintf((char *)ap_Stack_ab8,"key%06d",kvs_names_00);
      pfStack_d60 = (fdb_config *)0x1163ef;
      sprintf((char *)&fStack_cb8,"value%08d(%s)",kvs_names_00);
      pfStack_d60 = (fdb_config *)0x1163f7;
      sVar3 = strlen((char *)ap_Stack_ab8);
      pfVar11 = (fdb_config *)(sVar3 + 1);
      pfStack_d60 = (fdb_config *)0x116403;
      sVar3 = strlen((char *)&fStack_cb8);
      pfStack_d60 = (fdb_config *)0x116420;
      fdb_doc_create((fdb_doc **)auStack_d48,ap_Stack_ab8,(size_t)pfVar11,(void *)0x0,0,&fStack_cb8,
                     sVar3 + 1);
      pfStack_d60 = (fdb_config *)0x11642f;
      fVar1 = fdb_set(pfStack_d28,(fdb_doc *)auStack_d48._0_8_);
      if (fVar1 != FDB_RESULT_SUCCESS) {
        pfStack_d60 = (fdb_config *)0x1168ed;
        multi_kv_fdb_open_custom_cmp_test();
        goto LAB_001168ed;
      }
      pfStack_d60 = (fdb_config *)0x116441;
      fdb_doc_free((fdb_doc *)auStack_d48._0_8_);
      uVar9 = (int)kvs_names_00 + 1;
      kvs_names_00 = (char **)(ulong)uVar9;
    } while (uVar9 != 1000);
    pcVar10 = "kv1_custom_cmp";
    kvs_names_00 = (char **)0x0;
    do {
      pfStack_d60 = (fdb_config *)0x116480;
      sprintf((char *)ap_Stack_ab8,"key%06d",kvs_names_00);
      pfStack_d60 = (fdb_config *)0x116496;
      sprintf((char *)&fStack_cb8,"value%08d(%s)",kvs_names_00);
      pfStack_d60 = (fdb_config *)0x11649e;
      sVar3 = strlen((char *)ap_Stack_ab8);
      pfVar11 = (fdb_config *)(sVar3 + 1);
      pfStack_d60 = (fdb_config *)0x1164aa;
      sVar3 = strlen((char *)&fStack_cb8);
      pfStack_d60 = (fdb_config *)0x1164c7;
      fdb_doc_create((fdb_doc **)auStack_d48,ap_Stack_ab8,(size_t)pfVar11,(void *)0x0,0,&fStack_cb8,
                     sVar3 + 1);
      pfStack_d60 = (fdb_config *)0x1164d6;
      fVar1 = fdb_set(pfStack_d30,(fdb_doc *)auStack_d48._0_8_);
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001168ed;
      pfStack_d60 = (fdb_config *)0x1164e8;
      fdb_doc_free((fdb_doc *)auStack_d48._0_8_);
      uVar9 = (int)kvs_names_00 + 1;
      kvs_names_00 = (char **)(ulong)uVar9;
    } while (uVar9 != 1000);
    functions_00 = ap_Stack_ab8;
    pcVar8 = "kv2";
    unaff_R13 = (char *)&fStack_cb8;
    pcVar4 = auStack_d48;
    kvs_names_00 = (char **)0x0;
    do {
      pfStack_d60 = (fdb_config *)0x116527;
      sprintf((char *)functions_00,"key%06d",kvs_names_00);
      pfStack_d60 = (fdb_config *)0x11653d;
      sprintf(unaff_R13,"value%08d(%s)",kvs_names_00);
      pfStack_d60 = (fdb_config *)0x116545;
      sVar3 = strlen((char *)functions_00);
      pfVar11 = (fdb_config *)(sVar3 + 1);
      pfStack_d60 = (fdb_config *)0x116551;
      sVar3 = strlen(unaff_R13);
      pfStack_d60 = (fdb_config *)0x11656e;
      fdb_doc_create((fdb_doc **)pcVar4,functions_00,(size_t)pfVar11,(void *)0x0,0,unaff_R13,
                     sVar3 + 1);
      pfStack_d60 = (fdb_config *)0x11657d;
      fVar1 = fdb_set((fdb_kvs_handle *)auStack_d48._16_8_,(fdb_doc *)auStack_d48._0_8_);
      pcVar10 = pcVar8;
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001168f2;
      pfStack_d60 = (fdb_config *)0x11658f;
      fdb_doc_free((fdb_doc *)auStack_d48._0_8_);
      uVar9 = (int)kvs_names_00 + 1;
      kvs_names_00 = (char **)(ulong)uVar9;
    } while (uVar9 != 1000);
    pfStack_d60 = (fdb_config *)0x1165a9;
    fVar1 = fdb_commit((fdb_file_handle *)auStack_d48._8_8_,'\0');
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011694a;
    pfStack_d60 = (fdb_config *)0x1165bb;
    fVar1 = fdb_close((fdb_file_handle *)auStack_d48._8_8_);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011694f;
    pfStack_d60 = (fdb_config *)0x1165dc;
    fVar1 = fdb_open((fdb_file_handle **)(auStack_d48 + 8),"./multi_kv_test",&fStack_bb0);
    if (fVar1 == FDB_RESULT_SUCCESS) goto LAB_00116954;
    pfStack_d60 = (fdb_config *)0x116614;
    fVar1 = fdb_open_custom_cmp((fdb_file_handle **)(auStack_d48 + 8),"./multi_kv_test",&fStack_bb0,
                                3,&pcStack_ce8,&p_Stack_d08,(void **)0x0);
    if (fVar1 == FDB_RESULT_SUCCESS) goto LAB_00116959;
    pcStack_cf8 = _multi_kv_test_keycmp;
    pfStack_d60 = (fdb_config *)0x116657;
    fVar1 = fdb_open_custom_cmp((fdb_file_handle **)(auStack_d48 + 8),"./multi_kv_test",&fStack_bb0,
                                3,&pcStack_ce8,&p_Stack_d08,(void **)0x0);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011695e;
    pfStack_d60 = (fdb_config *)0x116675;
    fVar1 = fdb_kvs_open((fdb_file_handle *)auStack_d48._8_8_,&pfStack_d28,(char *)0x0,&fStack_d20);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116963;
    pfStack_d60 = (fdb_config *)0x116698;
    fVar1 = fdb_kvs_open((fdb_file_handle *)auStack_d48._8_8_,&pfStack_d30,"kv1",&fStack_d20);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116968;
    pfStack_d60 = (fdb_config *)0x1166bb;
    fVar1 = fdb_kvs_open((fdb_file_handle *)auStack_d48._8_8_,
                         (fdb_kvs_handle **)(auStack_d48 + 0x10),"kv2",&fStack_d20);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011696d;
    functions_00 = ap_Stack_ab8;
    unaff_R13 = (char *)&fStack_cb8;
    pcVar4 = auStack_d48;
    kvs_names_00 = (char **)0x0;
    do {
      pfStack_d60 = (fdb_config *)0x1166ed;
      sprintf((char *)functions_00,"key%06d",kvs_names_00);
      pfStack_d60 = (fdb_config *)0x116707;
      sprintf(unaff_R13,"value%08d(%s)",kvs_names_00);
      pfStack_d60 = (fdb_config *)0x11670f;
      sVar3 = strlen((char *)functions_00);
      pfStack_d60 = (fdb_config *)0x11672e;
      fdb_doc_create((fdb_doc **)pcVar4,functions_00,sVar3 + 1,(void *)0x0,0,(void *)0x0,0);
      pfStack_d60 = (fdb_config *)0x11673d;
      fVar1 = fdb_get(pfStack_d28,(fdb_doc *)auStack_d48._0_8_);
      pcVar10 = (char *)auStack_d48._0_8_;
      doc_00 = (fdb_doc *)pcVar8;
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116907;
      pfVar11 = *(fdb_config **)(auStack_d48._0_8_ + 0x40);
      pfStack_d60 = (fdb_config *)0x11675f;
      iVar2 = bcmp(unaff_R13,pfVar11,*(size_t *)(auStack_d48._0_8_ + 0x10));
      if (iVar2 != 0) goto LAB_001168f7;
      pfStack_d60 = (fdb_config *)0x11676f;
      fdb_doc_free((fdb_doc *)pcVar10);
      pfStack_d60 = (fdb_config *)0x116789;
      sprintf(unaff_R13,"value%08d(%s)",kvs_names_00);
      pfStack_d60 = (fdb_config *)0x116791;
      sVar3 = strlen((char *)functions_00);
      pfStack_d60 = (fdb_config *)0x1167b0;
      fdb_doc_create((fdb_doc **)pcVar4,functions_00,sVar3 + 1,(void *)0x0,0,(void *)0x0,0);
      pfStack_d60 = (fdb_config *)0x1167bf;
      fVar1 = fdb_get(pfStack_d30,(fdb_doc *)auStack_d48._0_8_);
      doc_00 = (fdb_doc *)auStack_d48._0_8_;
      pcVar8 = pcVar10;
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011691c;
      pfVar11 = *(fdb_config **)(auStack_d48._0_8_ + 0x40);
      pfStack_d60 = (fdb_config *)0x1167e1;
      iVar2 = bcmp(unaff_R13,pfVar11,*(size_t *)(auStack_d48._0_8_ + 0x10));
      if (iVar2 != 0) goto LAB_0011690c;
      pfStack_d60 = (fdb_config *)0x1167f1;
      fdb_doc_free(doc_00);
      pfStack_d60 = (fdb_config *)0x11680b;
      sprintf(unaff_R13,"value%08d(%s)",kvs_names_00);
      pfStack_d60 = (fdb_config *)0x116813;
      sVar3 = strlen((char *)functions_00);
      pfStack_d60 = (fdb_config *)0x116832;
      fdb_doc_create((fdb_doc **)pcVar4,functions_00,sVar3 + 1,(void *)0x0,0,(void *)0x0,0);
      pfStack_d60 = (fdb_config *)0x116841;
      fVar1 = fdb_get((fdb_kvs_handle *)auStack_d48._16_8_,(fdb_doc *)auStack_d48._0_8_);
      pcVar8 = (char *)auStack_d48._0_8_;
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116931;
      pfVar11 = *(fdb_config **)(auStack_d48._0_8_ + 0x40);
      pfStack_d60 = (fdb_config *)0x116863;
      iVar2 = bcmp(unaff_R13,pfVar11,*(size_t *)(auStack_d48._0_8_ + 0x10));
      if (iVar2 != 0) goto LAB_00116921;
      pfStack_d60 = (fdb_config *)0x116873;
      fdb_doc_free((fdb_doc *)pcVar8);
      uVar9 = (int)kvs_names_00 + 1;
      kvs_names_00 = (char **)(ulong)uVar9;
    } while (uVar9 != 1000);
    pfStack_d60 = (fdb_config *)0x11688b;
    fVar1 = fdb_close((fdb_file_handle *)auStack_d48._8_8_);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116972;
    pfStack_d60 = (fdb_config *)0x116898;
    fVar1 = fdb_shutdown();
    if (fVar1 == FDB_RESULT_SUCCESS) {
      pfStack_d60 = (fdb_config *)0x1168a5;
      memleak_end();
      pcVar8 = "%s PASSED\n";
      if (multi_kv_fdb_open_custom_cmp_test()::__test_pass != '\0') {
        pcVar8 = "%s FAILED\n";
      }
      pfStack_d60 = (fdb_config *)0x1168d6;
      fprintf(_stderr,pcVar8,"multiple KV instances fdb_open_custom_cmp test");
      return;
    }
  }
  else {
LAB_00116936:
    pfStack_d60 = (fdb_config *)0x11693b;
    multi_kv_fdb_open_custom_cmp_test();
LAB_0011693b:
    pfStack_d60 = (fdb_config *)0x116940;
    multi_kv_fdb_open_custom_cmp_test();
LAB_00116940:
    pfStack_d60 = (fdb_config *)0x116945;
    multi_kv_fdb_open_custom_cmp_test();
    pcVar8 = (char *)doc_00;
LAB_00116945:
    pfStack_d60 = (fdb_config *)0x11694a;
    multi_kv_fdb_open_custom_cmp_test();
LAB_0011694a:
    pfStack_d60 = (fdb_config *)0x11694f;
    multi_kv_fdb_open_custom_cmp_test();
LAB_0011694f:
    pfStack_d60 = (fdb_config *)0x116954;
    multi_kv_fdb_open_custom_cmp_test();
LAB_00116954:
    pfStack_d60 = (fdb_config *)0x116959;
    multi_kv_fdb_open_custom_cmp_test();
LAB_00116959:
    pfStack_d60 = (fdb_config *)0x11695e;
    multi_kv_fdb_open_custom_cmp_test();
LAB_0011695e:
    pfStack_d60 = (fdb_config *)0x116963;
    multi_kv_fdb_open_custom_cmp_test();
LAB_00116963:
    pfStack_d60 = (fdb_config *)0x116968;
    multi_kv_fdb_open_custom_cmp_test();
LAB_00116968:
    pfStack_d60 = (fdb_config *)0x11696d;
    multi_kv_fdb_open_custom_cmp_test();
LAB_0011696d:
    pfStack_d60 = (fdb_config *)0x116972;
    multi_kv_fdb_open_custom_cmp_test();
LAB_00116972:
    pfStack_d60 = (fdb_config *)0x116977;
    multi_kv_fdb_open_custom_cmp_test();
  }
  pfStack_d60 = (fdb_config *)multi_kv_use_existing_mode_test;
  multi_kv_fdb_open_custom_cmp_test();
  pfStackY_10e8 = (fdb_config *)0x116999;
  ppcStack_d88 = kvs_names_00;
  pfStack_d80 = (fdb_doc *)pcVar8;
  pfStack_d78 = (fdb_config *)unaff_R13;
  pp_Stack_d70 = functions_00;
  pfStack_d68 = pfVar11;
  pfStack_d60 = (fdb_config *)pcVar4;
  gettimeofday(&tStack_10a0,(__timezone_ptr_t)0x0);
  builtin_strncpy(acStack_1090,"rm -rf  multi_kv_test*",0x17);
  pfStackY_10e8 = (fdb_config *)0x1169bb;
  system(acStack_1090);
  pfStackY_10e8 = (fdb_config *)0x1169c0;
  memleak_start();
  pfVar7 = &fStack_f88;
  pfStackY_10e8 = (fdb_config *)0x1169d0;
  fdb_get_default_config();
  pfStackY_10e8 = (fdb_config *)0x1169da;
  fdb_get_default_kvs_config();
  fStack_f88.seqtree_opt = '\x01';
  fStack_f88.wal_threshold = 0x100;
  fStack_f88.buffercache_size = 0;
  fStack_f88.multi_kv_instances = true;
  pfStackY_10e8 = (fdb_config *)0x116a06;
  fVar1 = fdb_open(&pfStack_10d0,"./multi_kv_test_multi",pfVar7);
  if (fVar1 == FDB_RESULT_SUCCESS) {
    pfStackY_10e8 = (fdb_config *)0x116a24;
    fVar1 = fdb_kvs_open(pfStack_10d0,&pfStack_10c0,(char *)0x0,&fStack_10b8);
    pfVar6 = pfVar11;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116e9f;
    functions_00 = ap_Stack_e90;
    pfVar7 = (fdb_config *)0x0;
    do {
      pfStackY_10e8 = (fdb_config *)0x116a5a;
      sprintf((char *)functions_00,"key%06d",pfVar7);
      pfStackY_10e8 = (fdb_config *)0x116a70;
      sprintf(acStack_1090,"value%08d(%s)",pfVar7);
      pfStackY_10e8 = (fdb_config *)0x116a78;
      sVar3 = strlen((char *)functions_00);
      pfVar6 = (fdb_config *)(sVar3 + 1);
      pfStackY_10e8 = (fdb_config *)0x116a84;
      sVar3 = strlen(acStack_1090);
      pfStackY_10e8 = (fdb_config *)0x116aa1;
      fdb_doc_create((fdb_doc **)&pfStack_10c8,functions_00,(size_t)pfVar6,(void *)0x0,0,
                     acStack_1090,sVar3 + 1);
      pfStackY_10e8 = (fdb_config *)0x116ab0;
      fVar1 = fdb_set(pfStack_10c0,(fdb_doc *)pfStack_10c8);
      if (fVar1 != FDB_RESULT_SUCCESS) {
        pfStackY_10e8 = (fdb_config *)0x116e71;
        multi_kv_use_existing_mode_test();
        goto LAB_00116e71;
      }
      pfStackY_10e8 = (fdb_config *)0x116ac2;
      fdb_doc_free((fdb_doc *)pfStack_10c8);
      uVar9 = (int)pfVar7 + 1;
      pfVar7 = (fdb_config *)(ulong)uVar9;
    } while (uVar9 != 1000);
    pfStackY_10e8 = (fdb_config *)0x116adc;
    fVar1 = fdb_commit(pfStack_10d0,'\0');
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116ea4;
    pfStackY_10e8 = (fdb_config *)0x116aee;
    fVar1 = fdb_close(pfStack_10d0);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116ea9;
    fStack_f88.multi_kv_instances = false;
    pfStackY_10e8 = (fdb_config *)0x116b13;
    fVar1 = fdb_open(&pfStack_10d0,"./multi_kv_test_multi",&fStack_f88);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116eae;
    pfStackY_10e8 = (fdb_config *)0x116b31;
    fVar1 = fdb_kvs_open(pfStack_10d0,&pfStack_10c0,(char *)0x0,&fStack_10b8);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116eb3;
    functions_00 = ap_Stack_e90;
    pfVar7 = (fdb_config *)0x0;
    pfVar11 = pfVar6;
    do {
      pfStackY_10e8 = (fdb_config *)0x116b60;
      sprintf((char *)functions_00,"key%06d",pfVar7);
      pfStackY_10e8 = (fdb_config *)0x116b7a;
      sprintf(acStack_1090,"value%08d(%s)",pfVar7);
      pfStackY_10e8 = (fdb_config *)0x116b82;
      sVar3 = strlen((char *)functions_00);
      pfStackY_10e8 = (fdb_config *)0x116ba1;
      fdb_doc_create((fdb_doc **)&pfStack_10c8,functions_00,sVar3 + 1,(void *)0x0,0,(void *)0x0,0);
      pfStackY_10e8 = (fdb_config *)0x116bb0;
      fVar1 = fdb_get(pfStack_10c0,(fdb_doc *)pfStack_10c8);
      pfVar6 = pfStack_10c8;
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116e7e;
      pfStackY_10e8 = (fdb_config *)0x116bd0;
      iVar2 = bcmp(acStack_1090,*(void **)&pfStack_10c8->multi_kv_instances,
                   pfStack_10c8->wal_threshold);
      if (iVar2 != 0) goto LAB_00116e71;
      pfStackY_10e8 = (fdb_config *)0x116be0;
      fdb_doc_free((fdb_doc *)pfVar6);
      uVar9 = (int)pfVar7 + 1;
      pfVar7 = (fdb_config *)(ulong)uVar9;
      pfVar11 = pfVar6;
    } while (uVar9 != 1000);
    pfStackY_10e8 = (fdb_config *)0x116bf8;
    fVar1 = fdb_close(pfStack_10d0);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116eb8;
    fStack_f88.multi_kv_instances = false;
    pfStackY_10e8 = (fdb_config *)0x116c1d;
    fVar1 = fdb_open(&pfStack_10d0,"./multi_kv_test_single",&fStack_f88);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116ebd;
    pfStackY_10e8 = (fdb_config *)0x116c3b;
    fVar1 = fdb_kvs_open(pfStack_10d0,&pfStack_10c0,(char *)0x0,&fStack_10b8);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116ec2;
    functions_00 = ap_Stack_e90;
    pfVar7 = (fdb_config *)0x0;
    do {
      pfStackY_10e8 = (fdb_config *)0x116c71;
      sprintf((char *)functions_00,"key%06d",pfVar7);
      pfStackY_10e8 = (fdb_config *)0x116c87;
      sprintf(acStack_1090,"value%08d(%s)",pfVar7);
      pfStackY_10e8 = (fdb_config *)0x116c8f;
      sVar3 = strlen((char *)functions_00);
      pfVar6 = (fdb_config *)(sVar3 + 1);
      pfStackY_10e8 = (fdb_config *)0x116c9b;
      sVar3 = strlen(acStack_1090);
      pfStackY_10e8 = (fdb_config *)0x116cb8;
      fdb_doc_create((fdb_doc **)&pfStack_10c8,functions_00,(size_t)pfVar6,(void *)0x0,0,
                     acStack_1090,sVar3 + 1);
      pfStackY_10e8 = (fdb_config *)0x116cc7;
      fVar1 = fdb_set(pfStack_10c0,(fdb_doc *)pfStack_10c8);
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116e83;
      pfStackY_10e8 = (fdb_config *)0x116cd9;
      fdb_doc_free((fdb_doc *)pfStack_10c8);
      uVar9 = (int)pfVar7 + 1;
      pfVar7 = (fdb_config *)(ulong)uVar9;
    } while (uVar9 != 1000);
    pfStackY_10e8 = (fdb_config *)0x116cf3;
    fVar1 = fdb_commit(pfStack_10d0,'\0');
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116ec7;
    pfStackY_10e8 = (fdb_config *)0x116d05;
    fVar1 = fdb_close(pfStack_10d0);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116ecc;
    fStack_f88.multi_kv_instances = true;
    pfStackY_10e8 = (fdb_config *)0x116d2a;
    fVar1 = fdb_open(&pfStack_10d0,"./multi_kv_test_single",&fStack_f88);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116ed1;
    pfStackY_10e8 = (fdb_config *)0x116d48;
    fVar1 = fdb_kvs_open(pfStack_10d0,&pfStack_10c0,(char *)0x0,&fStack_10b8);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116ed6;
    functions_00 = ap_Stack_e90;
    pfVar7 = (fdb_config *)0x0;
    pfVar11 = pfVar6;
    do {
      pfStackY_10e8 = (fdb_config *)0x116d77;
      sprintf((char *)functions_00,"key%06d",pfVar7);
      pfStackY_10e8 = (fdb_config *)0x116d91;
      sprintf(acStack_1090,"value%08d(%s)",pfVar7);
      pfStackY_10e8 = (fdb_config *)0x116d99;
      sVar3 = strlen((char *)functions_00);
      pfStackY_10e8 = (fdb_config *)0x116db8;
      fdb_doc_create((fdb_doc **)&pfStack_10c8,functions_00,sVar3 + 1,(void *)0x0,0,(void *)0x0,0);
      pfStackY_10e8 = (fdb_config *)0x116dc7;
      fVar1 = fdb_get(pfStack_10c0,(fdb_doc *)pfStack_10c8);
      pfVar6 = pfStack_10c8;
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00116e95;
      pfStackY_10e8 = (fdb_config *)0x116de7;
      iVar2 = bcmp(acStack_1090,*(void **)&pfStack_10c8->multi_kv_instances,
                   pfStack_10c8->wal_threshold);
      if (iVar2 != 0) goto LAB_00116e88;
      pfStackY_10e8 = (fdb_config *)0x116df7;
      fdb_doc_free((fdb_doc *)pfVar6);
      uVar9 = (int)pfVar7 + 1;
      pfVar7 = (fdb_config *)(ulong)uVar9;
      pfVar11 = pfVar6;
    } while (uVar9 != 1000);
    pfStackY_10e8 = (fdb_config *)0x116e0f;
    fVar1 = fdb_close(pfStack_10d0);
    if (fVar1 == FDB_RESULT_SUCCESS) {
      pfStackY_10e8 = (fdb_config *)0x116e1c;
      fVar1 = fdb_shutdown();
      if (fVar1 == FDB_RESULT_SUCCESS) {
        pfStackY_10e8 = (fdb_config *)0x116e29;
        memleak_end();
        pcVar8 = "%s PASSED\n";
        if (multi_kv_use_existing_mode_test()::__test_pass != '\0') {
          pcVar8 = "%s FAILED\n";
        }
        pfStackY_10e8 = (fdb_config *)0x116e5a;
        fprintf(_stderr,pcVar8,"multiple KV instances use existing mode test");
        return;
      }
      goto LAB_00116ee0;
    }
  }
  else {
LAB_00116e9a:
    pfStackY_10e8 = (fdb_config *)0x116e9f;
    multi_kv_use_existing_mode_test();
    pfVar6 = pfVar11;
LAB_00116e9f:
    pfStackY_10e8 = (fdb_config *)0x116ea4;
    multi_kv_use_existing_mode_test();
LAB_00116ea4:
    pfStackY_10e8 = (fdb_config *)0x116ea9;
    multi_kv_use_existing_mode_test();
LAB_00116ea9:
    pfStackY_10e8 = (fdb_config *)0x116eae;
    multi_kv_use_existing_mode_test();
LAB_00116eae:
    pfStackY_10e8 = (fdb_config *)0x116eb3;
    multi_kv_use_existing_mode_test();
LAB_00116eb3:
    pfStackY_10e8 = (fdb_config *)0x116eb8;
    multi_kv_use_existing_mode_test();
LAB_00116eb8:
    pfStackY_10e8 = (fdb_config *)0x116ebd;
    multi_kv_use_existing_mode_test();
LAB_00116ebd:
    pfStackY_10e8 = (fdb_config *)0x116ec2;
    multi_kv_use_existing_mode_test();
LAB_00116ec2:
    pfStackY_10e8 = (fdb_config *)0x116ec7;
    multi_kv_use_existing_mode_test();
LAB_00116ec7:
    pfStackY_10e8 = (fdb_config *)0x116ecc;
    multi_kv_use_existing_mode_test();
LAB_00116ecc:
    pfStackY_10e8 = (fdb_config *)0x116ed1;
    multi_kv_use_existing_mode_test();
LAB_00116ed1:
    pfStackY_10e8 = (fdb_config *)0x116ed6;
    multi_kv_use_existing_mode_test();
LAB_00116ed6:
    pfStackY_10e8 = (fdb_config *)0x116edb;
    multi_kv_use_existing_mode_test();
  }
  pfStackY_10e8 = (fdb_config *)0x116ee0;
  multi_kv_use_existing_mode_test();
LAB_00116ee0:
  pfStackY_10e8 = (fdb_config *)_opening_thread;
  multi_kv_use_existing_mode_test();
  pfStackY_10f8 = pfVar7;
  pp_StackY_10f0 = functions_00;
  pfStackY_10e8 = pfVar6;
  fdb_get_default_config();
  lVar12 = 0;
  gettimeofday(&tStackY_1520,(__timezone_ptr_t)0x0);
  do {
    fVar1 = fdb_open((fdb_file_handle **)((long)apfStackY_1418 + lVar12),"multi_kv_test2",
                     &fStackY_1510);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
              ,0x92d);
      __assert_fail("s == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                    ,0x92d,"void *_opening_thread(void *)");
    }
    lVar12 = lVar12 + 8;
  } while (lVar12 != 800);
  lVar12 = 0;
  do {
    fVar1 = fdb_close(apfStackY_1418[lVar12]);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
              ,0x931);
      __assert_fail("s == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                    ,0x931,"void *_opening_thread(void *)");
    }
    lVar12 = lVar12 + 1;
  } while (lVar12 != 100);
  pthread_exit((void *)0x0);
}

Assistant:

void multi_kv_rollback_test(uint8_t opt, size_t chunksize)
{
    TEST_INIT();

    int n = 100;
    int i, r;
    char key[256], value[256];
    char keystr[] = "key%06d";
    char valuestr[] = "value%08d(%s)";
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db, *kv1, *kv2;
    fdb_seqnum_t seq1, seq2, seq3;
    fdb_config config;
    fdb_kvs_config kvs_config;
    fdb_doc *doc;
    fdb_status s;

    char *kvs_names[] = {NULL, (char*)"kv1", (char*)"kv2"};
    fdb_custom_cmp_variable functions[] = {_multi_kv_test_keycmp,
                                           _multi_kv_test_keycmp,
                                           _multi_kv_test_keycmp};

    sprintf(value, SHELL_DEL" multi_kv_test*");
    r = system(value);
    (void)r;

    memleak_start();

    config = fdb_get_default_config();
    kvs_config = fdb_get_default_kvs_config();
    config.seqtree_opt = FDB_SEQTREE_USE; // enable seqtree since get_byseq
    config.chunksize = chunksize;
    config.multi_kv_instances = true;
    config.wal_threshold = 1000;
    config.buffercache_size = 0;
    // for rollback, disable block reusing
    config.block_reusing_threshold = 0;

    if (opt & MULTI_KV_VAR_CMP) {
        s = fdb_open_custom_cmp(&dbfile, "./multi_kv_test", &config,
                                3, kvs_names, functions, NULL);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
    } else {
        s = fdb_open(&dbfile, "./multi_kv_test", &config);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
    }
    s = fdb_kvs_open(dbfile, &db, NULL, &kvs_config);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    s = fdb_kvs_open(dbfile, &kv1, "kv1", &kvs_config);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    s = fdb_kvs_open(dbfile, &kv2, "kv2", &kvs_config);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    // write documents first time
    for (i=0;i<n;++i){
        sprintf(key, keystr, i);
        sprintf(value, valuestr, i, "default(commit1)");
        fdb_doc_create(&doc, key, strlen(key)+1, NULL, 0, value, strlen(value)+1);
        s = fdb_set(db, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        fdb_doc_free(doc);
        sprintf(value, valuestr, i, "kv1(commit1)");
        fdb_doc_create(&doc, key, strlen(key)+1, NULL, 0, value, strlen(value)+1);
        s = fdb_set(kv1, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        if (i%15 == 0) s = fdb_set(kv1, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        fdb_doc_free(doc);
        sprintf(value, valuestr, i, "kv2(commit1)");
        fdb_doc_create(&doc, key, strlen(key)+1, NULL, 0, value, strlen(value)+1);
        s = fdb_set(kv2, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        if (i%27 == 0) s = fdb_set(kv2, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        fdb_doc_free(doc);
    }
    s = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    s = fdb_get_kvs_seqnum(kv1, &seq1);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    // write documents second time
    for (i=0;i<n;++i){
        sprintf(key, keystr, i);
        sprintf(value, valuestr, i, "default(commit2)");
        fdb_doc_create(&doc, key, strlen(key)+1, NULL, 0, value, strlen(value)+1);
        s = fdb_set(db, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        fdb_doc_free(doc);
        sprintf(value, valuestr, i, "kv1(commit2)");
        fdb_doc_create(&doc, key, strlen(key)+1, NULL, 0, value, strlen(value)+1);
        s = fdb_set(kv1, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        if (i%15 == 0) s = fdb_set(kv1, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        fdb_doc_free(doc);
        sprintf(value, valuestr, i, "kv2(commit2)");
        fdb_doc_create(&doc, key, strlen(key)+1, NULL, 0, value, strlen(value)+1);
        s = fdb_set(kv2, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        if (i%27 == 0) s = fdb_set(kv2, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        fdb_doc_free(doc);
    }
    s = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    s = fdb_get_kvs_seqnum(db, &seq2);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    // write documents third time
    for (i=0;i<n;++i){
        sprintf(key, keystr, i);
        sprintf(value, valuestr, i, "default(commit3)");
        fdb_doc_create(&doc, key, strlen(key)+1, NULL, 0, value, strlen(value)+1);
        s = fdb_set(db, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        fdb_doc_free(doc);
        sprintf(value, valuestr, i, "kv1(commit3)");
        fdb_doc_create(&doc, key, strlen(key)+1, NULL, 0, value, strlen(value)+1);
        s = fdb_set(kv1, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        if (i%15 == 0) s = fdb_set(kv1, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        fdb_doc_free(doc);
        sprintf(value, valuestr, i, "kv2(commit3)");
        fdb_doc_create(&doc, key, strlen(key)+1, NULL, 0, value, strlen(value)+1);
        s = fdb_set(kv2, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        if (i%27 == 0) s = fdb_set(kv2, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        fdb_doc_free(doc);
    }
    s = fdb_commit(dbfile, FDB_COMMIT_NORMAL);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    s = fdb_get_kvs_seqnum(kv2, &seq3);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    // write documents third time
    for (i=0;i<n;++i){
        sprintf(key, keystr, i);
        sprintf(value, valuestr, i, "default(commit4)");
        fdb_doc_create(&doc, key, strlen(key)+1, NULL, 0, value, strlen(value)+1);
        s = fdb_set(db, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        fdb_doc_free(doc);
        sprintf(value, valuestr, i, "kv1(commit4)");
        fdb_doc_create(&doc, key, strlen(key)+1, NULL, 0, value, strlen(value)+1);
        s = fdb_set(kv1, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        if (i%15 == 0) s = fdb_set(kv1, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        fdb_doc_free(doc);
        sprintf(value, valuestr, i, "kv2(commit4)");
        fdb_doc_create(&doc, key, strlen(key)+1, NULL, 0, value, strlen(value)+1);
        s = fdb_set(kv2, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        if (i%27 == 0) s = fdb_set(kv2, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        fdb_doc_free(doc);
    }
    s = fdb_commit(dbfile, FDB_COMMIT_NORMAL);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    // rollback kv1 using seq1
    s = fdb_rollback(&kv1, seq1);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    // retrieve check
    for (i=0;i<n;++i){
        sprintf(key, keystr, i);
        sprintf(value, valuestr, i, "default(commit4)");
        fdb_doc_create(&doc, key, strlen(key)+1, NULL, 0, NULL, 0);
        s = fdb_get(db, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        TEST_CMP(value, doc->body, doc->bodylen);
        fdb_doc_free(doc);
        sprintf(value, valuestr, i, "kv1(commit1)");
        fdb_doc_create(&doc, key, strlen(key)+1, NULL, 0, NULL, 0);
        s = fdb_get(kv1, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        TEST_CMP(value, doc->body, doc->bodylen);
        fdb_doc_free(doc);
        sprintf(value, valuestr, i, "kv2(commit4)");
        fdb_doc_create(&doc, key, strlen(key)+1, NULL, 0, NULL, 0);
        s = fdb_get(kv2, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        TEST_CMP(value, doc->body, doc->bodylen);
        fdb_doc_free(doc);
    }

    // rollback db using seq2
    s = fdb_rollback(&db, seq2);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    // retrieve check
    for (i=0;i<n;++i){
        sprintf(key, keystr, i);
        sprintf(value, valuestr, i, "default(commit2)");
        fdb_doc_create(&doc, key, strlen(key)+1, NULL, 0, NULL, 0);
        s = fdb_get(db, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        TEST_CMP(value, doc->body, doc->bodylen);
        fdb_doc_free(doc);
        sprintf(value, valuestr, i, "kv1(commit1)");
        fdb_doc_create(&doc, key, strlen(key)+1, NULL, 0, NULL, 0);
        s = fdb_get(kv1, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        TEST_CMP(value, doc->body, doc->bodylen);
        fdb_doc_free(doc);
        sprintf(value, valuestr, i, "kv2(commit4)");
        fdb_doc_create(&doc, key, strlen(key)+1, NULL, 0, NULL, 0);
        s = fdb_get(kv2, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        TEST_CMP(value, doc->body, doc->bodylen);
        fdb_doc_free(doc);
    }

    // rollback db using seq3
    s = fdb_rollback(&kv2, seq3);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    // retrieve check
    for (i=0;i<n;++i){
        sprintf(key, keystr, i);
        sprintf(value, valuestr, i, "default(commit2)");
        fdb_doc_create(&doc, key, strlen(key)+1, NULL, 0, NULL, 0);
        s = fdb_get(db, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        TEST_CMP(value, doc->body, doc->bodylen);
        fdb_doc_free(doc);
        sprintf(value, valuestr, i, "kv1(commit1)");
        fdb_doc_create(&doc, key, strlen(key)+1, NULL, 0, NULL, 0);
        s = fdb_get(kv1, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        TEST_CMP(value, doc->body, doc->bodylen);
        fdb_doc_free(doc);
        sprintf(value, valuestr, i, "kv2(commit3)");
        fdb_doc_create(&doc, key, strlen(key)+1, NULL, 0, NULL, 0);
        s = fdb_get(kv2, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        TEST_CMP(value, doc->body, doc->bodylen);
        fdb_doc_free(doc);
    }

    // close & re-open
    s = fdb_kvs_close(kv1);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    s = fdb_kvs_close(kv2);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    s = fdb_close(dbfile);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    if (opt & MULTI_KV_VAR_CMP) {
        s = fdb_open_custom_cmp(&dbfile, "./multi_kv_test", &config,
                                3, kvs_names, functions, NULL);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
    } else {
        s = fdb_open(&dbfile, "./multi_kv_test", &config);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
    }
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    fdb_kvs_open(dbfile, &db, NULL, &kvs_config);
    fdb_kvs_open(dbfile, &kv1, "kv1", &kvs_config);
    fdb_kvs_open(dbfile, &kv2, "kv2", &kvs_config);

    // retrieve check after re-open
    for (i=0;i<n;++i){
        sprintf(key, keystr, i);
        sprintf(value, valuestr, i, "default(commit2)");
        fdb_doc_create(&doc, key, strlen(key)+1, NULL, 0, NULL, 0);
        s = fdb_get(db, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        TEST_CMP(value, doc->body, doc->bodylen);
        fdb_doc_free(doc);
        sprintf(value, valuestr, i, "kv1(commit1)");
        fdb_doc_create(&doc, key, strlen(key)+1, NULL, 0, NULL, 0);
        s = fdb_get(kv1, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        TEST_CMP(value, doc->body, doc->bodylen);
        fdb_doc_free(doc);
        sprintf(value, valuestr, i, "kv2(commit3)");
        fdb_doc_create(&doc, key, strlen(key)+1, NULL, 0, NULL, 0);
        s = fdb_get(kv2, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        TEST_CMP(value, doc->body, doc->bodylen);
        fdb_doc_free(doc);
    }

    fdb_kvs_close(kv1);
    fdb_kvs_close(kv2);
    fdb_close(dbfile);

    fdb_shutdown();

    memleak_end();

    if (opt & MULTI_KV_VAR_CMP) {
        TEST_RESULT("multiple KV instances rollback test "
                    "(custom key order)");
    } else {
        TEST_RESULT("multiple KV instances rollback test");
    }
}